

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroska_sem.c
# Opt level: O3

void MATROSKA_InitSemantic(void)

{
  MATROSKA_ContextSeekID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSeekID.Id = 0x53ab;
  MATROSKA_ContextSeekID.Class = 0x4e494245;
  MATROSKA_ContextSeekID.HasDefault = 0;
  MATROSKA_ContextSeekID.DefaultValue = 0;
  MATROSKA_ContextSeekID.ElementName = "SeekID";
  MATROSKA_ContextSeekID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSeekPosition.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSeekPosition.Id = 0x53ac;
  MATROSKA_ContextSeekPosition.Class = 0x54494245;
  MATROSKA_ContextSeekPosition.HasDefault = 0;
  MATROSKA_ContextSeekPosition.DefaultValue = 0;
  MATROSKA_ContextSeekPosition.ElementName = "SeekPosition";
  MATROSKA_ContextSeekPosition.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSeek.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSeek.Id = 0x4dbb;
  MATROSKA_ContextSeek.Class = 0x4b534b4d;
  MATROSKA_ContextSeek.HasDefault = 0;
  MATROSKA_ContextSeek.DefaultValue = 0;
  MATROSKA_ContextSeek.ElementName = "Seek";
  MATROSKA_ContextSeek.Semantic = EBML_SemanticSeek;
  MATROSKA_ContextSeekHead.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSeekHead.Id = 0x114d9b74;
  MATROSKA_ContextSeekHead.Class = 0x544d4245;
  MATROSKA_ContextSeekHead.HasDefault = 0;
  MATROSKA_ContextSeekHead.DefaultValue = 0;
  MATROSKA_ContextSeekHead.ElementName = "SeekHead";
  MATROSKA_ContextSeekHead.Semantic = EBML_SemanticSeekHead;
  MATROSKA_ContextSegmentUUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSegmentUUID.Id = 0x73a4;
  MATROSKA_ContextSegmentUUID.Class = 0x44494b4d;
  MATROSKA_ContextSegmentUUID.HasDefault = 0;
  MATROSKA_ContextSegmentUUID.DefaultValue = 0;
  MATROSKA_ContextSegmentUUID.ElementName = "SegmentUUID";
  MATROSKA_ContextSegmentUUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSegmentFilename.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSegmentFilename.Id = 0x7384;
  MATROSKA_ContextSegmentFilename.Class = 0x55534245;
  MATROSKA_ContextSegmentFilename.HasDefault = 0;
  MATROSKA_ContextSegmentFilename.DefaultValue = 0;
  MATROSKA_ContextSegmentFilename.ElementName = "SegmentFilename";
  MATROSKA_ContextSegmentFilename.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrevUUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrevUUID.Id = 0x3cb923;
  MATROSKA_ContextPrevUUID.Class = 0x44494b4d;
  MATROSKA_ContextPrevUUID.HasDefault = 0;
  MATROSKA_ContextPrevUUID.DefaultValue = 0;
  MATROSKA_ContextPrevUUID.ElementName = "PrevUUID";
  MATROSKA_ContextPrevUUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrevFilename.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrevFilename.Id = 0x3c83ab;
  MATROSKA_ContextPrevFilename.Class = 0x55534245;
  MATROSKA_ContextPrevFilename.HasDefault = 0;
  MATROSKA_ContextPrevFilename.DefaultValue = 0;
  MATROSKA_ContextPrevFilename.ElementName = "PrevFilename";
  MATROSKA_ContextPrevFilename.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextNextUUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextNextUUID.Id = 0x3eb923;
  MATROSKA_ContextNextUUID.Class = 0x44494b4d;
  MATROSKA_ContextNextUUID.HasDefault = 0;
  MATROSKA_ContextNextUUID.DefaultValue = 0;
  MATROSKA_ContextNextUUID.ElementName = "NextUUID";
  MATROSKA_ContextNextUUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextNextFilename.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextNextFilename.Id = 0x3e83bb;
  MATROSKA_ContextNextFilename.Class = 0x55534245;
  MATROSKA_ContextNextFilename.HasDefault = 0;
  MATROSKA_ContextNextFilename.DefaultValue = 0;
  MATROSKA_ContextNextFilename.ElementName = "NextFilename";
  MATROSKA_ContextNextFilename.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSegmentFamily.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSegmentFamily.Id = 0x4444;
  MATROSKA_ContextSegmentFamily.Class = 0x44494b4d;
  MATROSKA_ContextSegmentFamily.HasDefault = 0;
  MATROSKA_ContextSegmentFamily.DefaultValue = 0;
  MATROSKA_ContextSegmentFamily.ElementName = "SegmentFamily";
  MATROSKA_ContextSegmentFamily.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterTranslateID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterTranslateID.Id = 0x69a5;
  MATROSKA_ContextChapterTranslateID.Class = 0x4e494245;
  MATROSKA_ContextChapterTranslateID.HasDefault = 0;
  MATROSKA_ContextChapterTranslateID.DefaultValue = 0;
  MATROSKA_ContextChapterTranslateID.ElementName = "ChapterTranslateID";
  MATROSKA_ContextChapterTranslateID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterTranslateCodec.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterTranslateCodec.Id = 0x69bf;
  MATROSKA_ContextChapterTranslateCodec.Class = 0x54494245;
  MATROSKA_ContextChapterTranslateCodec.HasDefault = 0;
  MATROSKA_ContextChapterTranslateCodec.DefaultValue = 0;
  MATROSKA_ContextChapterTranslateCodec.ElementName = "ChapterTranslateCodec";
  MATROSKA_ContextChapterTranslateCodec.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterTranslateEditionUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterTranslateEditionUID.Id = 0x69fc;
  MATROSKA_ContextChapterTranslateEditionUID.Class = 0x54494245;
  MATROSKA_ContextChapterTranslateEditionUID.HasDefault = 0;
  MATROSKA_ContextChapterTranslateEditionUID.DefaultValue = 0;
  MATROSKA_ContextChapterTranslateEditionUID.ElementName = "ChapterTranslateEditionUID";
  MATROSKA_ContextChapterTranslateEditionUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterTranslate.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterTranslate.Id = 0x6924;
  MATROSKA_ContextChapterTranslate.Class = 0x544d4245;
  MATROSKA_ContextChapterTranslate.HasDefault = 0;
  MATROSKA_ContextChapterTranslate.DefaultValue = 0;
  MATROSKA_ContextChapterTranslate.ElementName = "ChapterTranslate";
  MATROSKA_ContextChapterTranslate.Semantic = EBML_SemanticChapterTranslate;
  MATROSKA_ContextTimestampScale.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTimestampScale.Id = 0x2ad7b1;
  MATROSKA_ContextTimestampScale.Class = 0x54494245;
  MATROSKA_ContextTimestampScale.HasDefault = 1;
  MATROSKA_ContextTimestampScale.DefaultValue = 1000000;
  MATROSKA_ContextTimestampScale.ElementName = "TimestampScale";
  MATROSKA_ContextTimestampScale.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDuration.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDuration.Id = 0x4489;
  MATROSKA_ContextDuration.Class = 0x4c464245;
  MATROSKA_ContextDuration.HasDefault = 0;
  MATROSKA_ContextDuration.DefaultValue = 0;
  MATROSKA_ContextDuration.ElementName = "Duration";
  MATROSKA_ContextDuration.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDateUTC.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDateUTC.Id = 0x4461;
  MATROSKA_ContextDateUTC.Class = 0x54444245;
  MATROSKA_ContextDateUTC.HasDefault = 0;
  MATROSKA_ContextDateUTC.DefaultValue = 0;
  MATROSKA_ContextDateUTC.ElementName = "DateUTC";
  MATROSKA_ContextDateUTC.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTitle.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTitle.Id = 0x7ba9;
  MATROSKA_ContextTitle.Class = 0x55534245;
  MATROSKA_ContextTitle.HasDefault = 0;
  MATROSKA_ContextTitle.DefaultValue = 0;
  MATROSKA_ContextTitle.ElementName = "Title";
  MATROSKA_ContextTitle.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextMuxingApp.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextMuxingApp.Id = 0x4d80;
  MATROSKA_ContextMuxingApp.Class = 0x55534245;
  MATROSKA_ContextMuxingApp.HasDefault = 0;
  MATROSKA_ContextMuxingApp.DefaultValue = 0;
  MATROSKA_ContextMuxingApp.ElementName = "MuxingApp";
  MATROSKA_ContextMuxingApp.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextWritingApp.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextWritingApp.Id = 0x5741;
  MATROSKA_ContextWritingApp.Class = 0x55534245;
  MATROSKA_ContextWritingApp.HasDefault = 0;
  MATROSKA_ContextWritingApp.DefaultValue = 0;
  MATROSKA_ContextWritingApp.ElementName = "WritingApp";
  MATROSKA_ContextWritingApp.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextInfo.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextInfo.Id = 0x1549a966;
  MATROSKA_ContextInfo.Class = 0x544d4245;
  MATROSKA_ContextInfo.HasDefault = 0;
  MATROSKA_ContextInfo.DefaultValue = 0;
  MATROSKA_ContextInfo.ElementName = "Info";
  MATROSKA_ContextInfo.Semantic = EBML_SemanticInfo;
  MATROSKA_ContextTimestamp.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTimestamp.Id = 0xe7;
  MATROSKA_ContextTimestamp.Class = 0x54494245;
  MATROSKA_ContextTimestamp.HasDefault = 0;
  MATROSKA_ContextTimestamp.DefaultValue = 0;
  MATROSKA_ContextTimestamp.ElementName = "Timestamp";
  MATROSKA_ContextTimestamp.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSilentTrackNumber.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSilentTrackNumber.Id = 0x58d7;
  MATROSKA_ContextSilentTrackNumber.Class = 0x54494245;
  MATROSKA_ContextSilentTrackNumber.HasDefault = 0;
  MATROSKA_ContextSilentTrackNumber.DefaultValue = 0;
  MATROSKA_ContextSilentTrackNumber.ElementName = "SilentTrackNumber";
  MATROSKA_ContextSilentTrackNumber.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSilentTracks.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSilentTracks.Id = 0x5854;
  MATROSKA_ContextSilentTracks.Class = 0x544d4245;
  MATROSKA_ContextSilentTracks.HasDefault = 0;
  MATROSKA_ContextSilentTracks.DefaultValue = 0;
  MATROSKA_ContextSilentTracks.ElementName = "SilentTracks";
  MATROSKA_ContextSilentTracks.Semantic = EBML_SemanticSilentTracks;
  MATROSKA_ContextPosition.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPosition.Id = 0xa7;
  MATROSKA_ContextPosition.Class = 0x54494245;
  MATROSKA_ContextPosition.HasDefault = 0;
  MATROSKA_ContextPosition.DefaultValue = 0;
  MATROSKA_ContextPosition.ElementName = "Position";
  MATROSKA_ContextPosition.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrevSize.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrevSize.Id = 0xab;
  MATROSKA_ContextPrevSize.Class = 0x54494245;
  MATROSKA_ContextPrevSize.HasDefault = 0;
  MATROSKA_ContextPrevSize.DefaultValue = 0;
  MATROSKA_ContextPrevSize.ElementName = "PrevSize";
  MATROSKA_ContextPrevSize.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSimpleBlock.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSimpleBlock.Id = 0xa3;
  MATROSKA_ContextSimpleBlock.Class = 0x4c424b4d;
  MATROSKA_ContextSimpleBlock.HasDefault = 0;
  MATROSKA_ContextSimpleBlock.DefaultValue = 0;
  MATROSKA_ContextSimpleBlock.ElementName = "SimpleBlock";
  MATROSKA_ContextSimpleBlock.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlock.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlock.Id = 0xa1;
  MATROSKA_ContextBlock.Class = 0x4c424b4d;
  MATROSKA_ContextBlock.HasDefault = 0;
  MATROSKA_ContextBlock.DefaultValue = 0;
  MATROSKA_ContextBlock.ElementName = "Block";
  MATROSKA_ContextBlock.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockVirtual.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockVirtual.Id = 0xa2;
  MATROSKA_ContextBlockVirtual.Class = 0x4e494245;
  MATROSKA_ContextBlockVirtual.HasDefault = 0;
  MATROSKA_ContextBlockVirtual.DefaultValue = 0;
  MATROSKA_ContextBlockVirtual.ElementName = "BlockVirtual";
  MATROSKA_ContextBlockVirtual.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockAdditional.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAdditional.Id = 0xa5;
  MATROSKA_ContextBlockAdditional.Class = 0x4e494245;
  MATROSKA_ContextBlockAdditional.HasDefault = 0;
  MATROSKA_ContextBlockAdditional.DefaultValue = 0;
  MATROSKA_ContextBlockAdditional.ElementName = "BlockAdditional";
  MATROSKA_ContextBlockAdditional.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockAddID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAddID.Id = 0xee;
  MATROSKA_ContextBlockAddID.Class = 0x54494245;
  MATROSKA_ContextBlockAddID.HasDefault = 1;
  MATROSKA_ContextBlockAddID.DefaultValue = 1;
  MATROSKA_ContextBlockAddID.ElementName = "BlockAddID";
  MATROSKA_ContextBlockAddID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockMore.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockMore.Id = 0xa6;
  MATROSKA_ContextBlockMore.Class = 0x544d4245;
  MATROSKA_ContextBlockMore.HasDefault = 0;
  MATROSKA_ContextBlockMore.DefaultValue = 0;
  MATROSKA_ContextBlockMore.ElementName = "BlockMore";
  MATROSKA_ContextBlockMore.Semantic = EBML_SemanticBlockMore;
  MATROSKA_ContextBlockAdditions.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAdditions.Id = 0x75a1;
  MATROSKA_ContextBlockAdditions.Class = 0x544d4245;
  MATROSKA_ContextBlockAdditions.HasDefault = 0;
  MATROSKA_ContextBlockAdditions.DefaultValue = 0;
  MATROSKA_ContextBlockAdditions.ElementName = "BlockAdditions";
  MATROSKA_ContextBlockAdditions.Semantic = EBML_SemanticBlockAdditions;
  MATROSKA_ContextBlockDuration.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockDuration.Id = 0x9b;
  MATROSKA_ContextBlockDuration.Class = 0x54494245;
  MATROSKA_ContextBlockDuration.HasDefault = 0;
  MATROSKA_ContextBlockDuration.DefaultValue = 0;
  MATROSKA_ContextBlockDuration.ElementName = "BlockDuration";
  MATROSKA_ContextBlockDuration.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextReferencePriority.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextReferencePriority.Id = 0xfa;
  MATROSKA_ContextReferencePriority.Class = 0x54494245;
  MATROSKA_ContextReferencePriority.HasDefault = 1;
  MATROSKA_ContextReferencePriority.DefaultValue = 0;
  MATROSKA_ContextReferencePriority.ElementName = "ReferencePriority";
  MATROSKA_ContextReferencePriority.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextReferenceBlock.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextReferenceBlock.Id = 0xfb;
  MATROSKA_ContextReferenceBlock.Class = 0x49534245;
  MATROSKA_ContextReferenceBlock.HasDefault = 0;
  MATROSKA_ContextReferenceBlock.DefaultValue = 0;
  MATROSKA_ContextReferenceBlock.ElementName = "ReferenceBlock";
  MATROSKA_ContextReferenceBlock.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextReferenceVirtual.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextReferenceVirtual.Id = 0xfd;
  MATROSKA_ContextReferenceVirtual.Class = 0x49534245;
  MATROSKA_ContextReferenceVirtual.HasDefault = 0;
  MATROSKA_ContextReferenceVirtual.DefaultValue = 0;
  MATROSKA_ContextReferenceVirtual.ElementName = "ReferenceVirtual";
  MATROSKA_ContextReferenceVirtual.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecState.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecState.Id = 0xa4;
  MATROSKA_ContextCodecState.Class = 0x4e494245;
  MATROSKA_ContextCodecState.HasDefault = 0;
  MATROSKA_ContextCodecState.DefaultValue = 0;
  MATROSKA_ContextCodecState.ElementName = "CodecState";
  MATROSKA_ContextCodecState.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDiscardPadding.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDiscardPadding.Id = 0x75a2;
  MATROSKA_ContextDiscardPadding.Class = 0x49534245;
  MATROSKA_ContextDiscardPadding.HasDefault = 0;
  MATROSKA_ContextDiscardPadding.DefaultValue = 0;
  MATROSKA_ContextDiscardPadding.ElementName = "DiscardPadding";
  MATROSKA_ContextDiscardPadding.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextLaceNumber.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextLaceNumber.Id = 0xcc;
  MATROSKA_ContextLaceNumber.Class = 0x54494245;
  MATROSKA_ContextLaceNumber.HasDefault = 0;
  MATROSKA_ContextLaceNumber.DefaultValue = 0;
  MATROSKA_ContextLaceNumber.ElementName = "LaceNumber";
  MATROSKA_ContextLaceNumber.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFrameNumber.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFrameNumber.Id = 0xcd;
  MATROSKA_ContextFrameNumber.Class = 0x54494245;
  MATROSKA_ContextFrameNumber.HasDefault = 1;
  MATROSKA_ContextFrameNumber.DefaultValue = 0;
  MATROSKA_ContextFrameNumber.ElementName = "FrameNumber";
  MATROSKA_ContextFrameNumber.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockAdditionID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAdditionID.Id = 0xcb;
  MATROSKA_ContextBlockAdditionID.Class = 0x54494245;
  MATROSKA_ContextBlockAdditionID.HasDefault = 1;
  MATROSKA_ContextBlockAdditionID.DefaultValue = 0;
  MATROSKA_ContextBlockAdditionID.ElementName = "BlockAdditionID";
  MATROSKA_ContextBlockAdditionID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDelay.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDelay.Id = 0xce;
  MATROSKA_ContextDelay.Class = 0x54494245;
  MATROSKA_ContextDelay.HasDefault = 1;
  MATROSKA_ContextDelay.DefaultValue = 0;
  MATROSKA_ContextDelay.ElementName = "Delay";
  MATROSKA_ContextDelay.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSliceDuration.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSliceDuration.Id = 0xcf;
  MATROSKA_ContextSliceDuration.Class = 0x54494245;
  MATROSKA_ContextSliceDuration.HasDefault = 1;
  MATROSKA_ContextSliceDuration.DefaultValue = 0;
  MATROSKA_ContextSliceDuration.ElementName = "SliceDuration";
  MATROSKA_ContextSliceDuration.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTimeSlice.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTimeSlice.Id = 0xe8;
  MATROSKA_ContextTimeSlice.Class = 0x544d4245;
  MATROSKA_ContextTimeSlice.HasDefault = 0;
  MATROSKA_ContextTimeSlice.DefaultValue = 0;
  MATROSKA_ContextTimeSlice.ElementName = "TimeSlice";
  MATROSKA_ContextTimeSlice.Semantic = EBML_SemanticTimeSlice;
  MATROSKA_ContextSlices.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSlices.Id = 0x8e;
  MATROSKA_ContextSlices.Class = 0x544d4245;
  MATROSKA_ContextSlices.HasDefault = 0;
  MATROSKA_ContextSlices.DefaultValue = 0;
  MATROSKA_ContextSlices.ElementName = "Slices";
  MATROSKA_ContextSlices.Semantic = EBML_SemanticSlices;
  MATROSKA_ContextReferenceOffset.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextReferenceOffset.Id = 0xc9;
  MATROSKA_ContextReferenceOffset.Class = 0x54494245;
  MATROSKA_ContextReferenceOffset.HasDefault = 0;
  MATROSKA_ContextReferenceOffset.DefaultValue = 0;
  MATROSKA_ContextReferenceOffset.ElementName = "ReferenceOffset";
  MATROSKA_ContextReferenceOffset.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextReferenceTimestamp.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextReferenceTimestamp.Id = 0xca;
  MATROSKA_ContextReferenceTimestamp.Class = 0x54494245;
  MATROSKA_ContextReferenceTimestamp.HasDefault = 0;
  MATROSKA_ContextReferenceTimestamp.DefaultValue = 0;
  MATROSKA_ContextReferenceTimestamp.ElementName = "ReferenceTimestamp";
  MATROSKA_ContextReferenceTimestamp.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextReferenceFrame.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextReferenceFrame.Id = 200;
  MATROSKA_ContextReferenceFrame.Class = 0x544d4245;
  MATROSKA_ContextReferenceFrame.HasDefault = 0;
  MATROSKA_ContextReferenceFrame.DefaultValue = 0;
  MATROSKA_ContextReferenceFrame.ElementName = "ReferenceFrame";
  MATROSKA_ContextReferenceFrame.Semantic = EBML_SemanticReferenceFrame;
  MATROSKA_ContextBlockGroup.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockGroup.Id = 0xa0;
  MATROSKA_ContextBlockGroup.Class = 0x47424b4d;
  MATROSKA_ContextBlockGroup.HasDefault = 0;
  MATROSKA_ContextBlockGroup.DefaultValue = 0;
  MATROSKA_ContextBlockGroup.ElementName = "BlockGroup";
  MATROSKA_ContextBlockGroup.Semantic = EBML_SemanticBlockGroup;
  MATROSKA_ContextEncryptedBlock.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEncryptedBlock.Id = 0xaf;
  MATROSKA_ContextEncryptedBlock.Class = 0x4e494245;
  MATROSKA_ContextEncryptedBlock.HasDefault = 0;
  MATROSKA_ContextEncryptedBlock.DefaultValue = 0;
  MATROSKA_ContextEncryptedBlock.ElementName = "EncryptedBlock";
  MATROSKA_ContextEncryptedBlock.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCluster.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCluster.Id = 0x1f43b675;
  MATROSKA_ContextCluster.Class = 0x55434b4d;
  MATROSKA_ContextCluster.HasDefault = 0;
  MATROSKA_ContextCluster.DefaultValue = 0;
  MATROSKA_ContextCluster.ElementName = "Cluster";
  MATROSKA_ContextCluster.Semantic = EBML_SemanticCluster;
  MATROSKA_ContextTrackNumber.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackNumber.Id = 0xd7;
  MATROSKA_ContextTrackNumber.Class = 0x54494245;
  MATROSKA_ContextTrackNumber.HasDefault = 0;
  MATROSKA_ContextTrackNumber.DefaultValue = 0;
  MATROSKA_ContextTrackNumber.ElementName = "TrackNumber";
  MATROSKA_ContextTrackNumber.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackUID.Id = 0x73c5;
  MATROSKA_ContextTrackUID.Class = 0x54494245;
  MATROSKA_ContextTrackUID.HasDefault = 0;
  MATROSKA_ContextTrackUID.DefaultValue = 0;
  MATROSKA_ContextTrackUID.ElementName = "TrackUID";
  MATROSKA_ContextTrackUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackType.Id = 0x83;
  MATROSKA_ContextTrackType.Class = 0x54494245;
  MATROSKA_ContextTrackType.HasDefault = 0;
  MATROSKA_ContextTrackType.DefaultValue = 0;
  MATROSKA_ContextTrackType.ElementName = "TrackType";
  MATROSKA_ContextTrackType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagEnabled.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagEnabled.Id = 0xb9;
  MATROSKA_ContextFlagEnabled.Class = 0x4f424245;
  MATROSKA_ContextFlagEnabled.HasDefault = 1;
  MATROSKA_ContextFlagEnabled.DefaultValue = 1;
  MATROSKA_ContextFlagEnabled.ElementName = "FlagEnabled";
  MATROSKA_ContextFlagEnabled.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagDefault.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagDefault.Id = 0x88;
  MATROSKA_ContextFlagDefault.Class = 0x4f424245;
  MATROSKA_ContextFlagDefault.HasDefault = 1;
  MATROSKA_ContextFlagDefault.DefaultValue = 1;
  MATROSKA_ContextFlagDefault.ElementName = "FlagDefault";
  MATROSKA_ContextFlagDefault.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagForced.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagForced.Id = 0x55aa;
  MATROSKA_ContextFlagForced.Class = 0x4f424245;
  MATROSKA_ContextFlagForced.HasDefault = 1;
  MATROSKA_ContextFlagForced.DefaultValue = 0;
  MATROSKA_ContextFlagForced.ElementName = "FlagForced";
  MATROSKA_ContextFlagForced.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagHearingImpaired.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagHearingImpaired.Id = 0x55ab;
  MATROSKA_ContextFlagHearingImpaired.Class = 0x4f424245;
  MATROSKA_ContextFlagHearingImpaired.HasDefault = 0;
  MATROSKA_ContextFlagHearingImpaired.DefaultValue = 0;
  MATROSKA_ContextFlagHearingImpaired.ElementName = "FlagHearingImpaired";
  MATROSKA_ContextFlagHearingImpaired.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagVisualImpaired.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagVisualImpaired.Id = 0x55ac;
  MATROSKA_ContextFlagVisualImpaired.Class = 0x4f424245;
  MATROSKA_ContextFlagVisualImpaired.HasDefault = 0;
  MATROSKA_ContextFlagVisualImpaired.DefaultValue = 0;
  MATROSKA_ContextFlagVisualImpaired.ElementName = "FlagVisualImpaired";
  MATROSKA_ContextFlagVisualImpaired.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagTextDescriptions.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagTextDescriptions.Id = 0x55ad;
  MATROSKA_ContextFlagTextDescriptions.Class = 0x4f424245;
  MATROSKA_ContextFlagTextDescriptions.HasDefault = 0;
  MATROSKA_ContextFlagTextDescriptions.DefaultValue = 0;
  MATROSKA_ContextFlagTextDescriptions.ElementName = "FlagTextDescriptions";
  MATROSKA_ContextFlagTextDescriptions.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagOriginal.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagOriginal.Id = 0x55ae;
  MATROSKA_ContextFlagOriginal.Class = 0x4f424245;
  MATROSKA_ContextFlagOriginal.HasDefault = 0;
  MATROSKA_ContextFlagOriginal.DefaultValue = 0;
  MATROSKA_ContextFlagOriginal.ElementName = "FlagOriginal";
  MATROSKA_ContextFlagOriginal.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagCommentary.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagCommentary.Id = 0x55af;
  MATROSKA_ContextFlagCommentary.Class = 0x4f424245;
  MATROSKA_ContextFlagCommentary.HasDefault = 0;
  MATROSKA_ContextFlagCommentary.DefaultValue = 0;
  MATROSKA_ContextFlagCommentary.ElementName = "FlagCommentary";
  MATROSKA_ContextFlagCommentary.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFlagLacing.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagLacing.Id = 0x9c;
  MATROSKA_ContextFlagLacing.Class = 0x4f424245;
  MATROSKA_ContextFlagLacing.HasDefault = 1;
  MATROSKA_ContextFlagLacing.DefaultValue = 1;
  MATROSKA_ContextFlagLacing.ElementName = "FlagLacing";
  MATROSKA_ContextFlagLacing.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextMinCache.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextMinCache.Id = 0x6de7;
  MATROSKA_ContextMinCache.Class = 0x54494245;
  MATROSKA_ContextMinCache.HasDefault = 1;
  MATROSKA_ContextMinCache.DefaultValue = 0;
  MATROSKA_ContextMinCache.ElementName = "MinCache";
  MATROSKA_ContextMinCache.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextMaxCache.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextMaxCache.Id = 0x6df8;
  MATROSKA_ContextMaxCache.Class = 0x54494245;
  MATROSKA_ContextMaxCache.HasDefault = 0;
  MATROSKA_ContextMaxCache.DefaultValue = 0;
  MATROSKA_ContextMaxCache.ElementName = "MaxCache";
  MATROSKA_ContextMaxCache.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDefaultDuration.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDefaultDuration.Id = 0x23e383;
  MATROSKA_ContextDefaultDuration.Class = 0x54494245;
  MATROSKA_ContextDefaultDuration.HasDefault = 0;
  MATROSKA_ContextDefaultDuration.DefaultValue = 0;
  MATROSKA_ContextDefaultDuration.ElementName = "DefaultDuration";
  MATROSKA_ContextDefaultDuration.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDefaultDecodedFieldDuration.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDefaultDecodedFieldDuration.Id = 0x234e7a;
  MATROSKA_ContextDefaultDecodedFieldDuration.Class = 0x54494245;
  MATROSKA_ContextDefaultDecodedFieldDuration.HasDefault = 0;
  MATROSKA_ContextDefaultDecodedFieldDuration.DefaultValue = 0;
  MATROSKA_ContextDefaultDecodedFieldDuration.ElementName = "DefaultDecodedFieldDuration";
  MATROSKA_ContextDefaultDecodedFieldDuration.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackTimestampScale.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackTimestampScale.Id = 0x23314f;
  MATROSKA_ContextTrackTimestampScale.Class = 0x4c464245;
  MATROSKA_ContextTrackTimestampScale.HasDefault = 1;
  MATROSKA_ContextTrackTimestampScale.DefaultValue = 1;
  MATROSKA_ContextTrackTimestampScale.ElementName = "TrackTimestampScale";
  MATROSKA_ContextTrackTimestampScale.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackOffset.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackOffset.Id = 0x537f;
  MATROSKA_ContextTrackOffset.Class = 0x49534245;
  MATROSKA_ContextTrackOffset.HasDefault = 1;
  MATROSKA_ContextTrackOffset.DefaultValue = 0;
  MATROSKA_ContextTrackOffset.ElementName = "TrackOffset";
  MATROSKA_ContextTrackOffset.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextMaxBlockAdditionID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextMaxBlockAdditionID.Id = 0x55ee;
  MATROSKA_ContextMaxBlockAdditionID.Class = 0x54494245;
  MATROSKA_ContextMaxBlockAdditionID.HasDefault = 1;
  MATROSKA_ContextMaxBlockAdditionID.DefaultValue = 0;
  MATROSKA_ContextMaxBlockAdditionID.ElementName = "MaxBlockAdditionID";
  MATROSKA_ContextMaxBlockAdditionID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockAddIDValue.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAddIDValue.Id = 0x41f0;
  MATROSKA_ContextBlockAddIDValue.Class = 0x54494245;
  MATROSKA_ContextBlockAddIDValue.HasDefault = 0;
  MATROSKA_ContextBlockAddIDValue.DefaultValue = 0;
  MATROSKA_ContextBlockAddIDValue.ElementName = "BlockAddIDValue";
  MATROSKA_ContextBlockAddIDValue.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockAddIDName.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAddIDName.Id = 0x41a4;
  MATROSKA_ContextBlockAddIDName.Class = 0x47534245;
  MATROSKA_ContextBlockAddIDName.HasDefault = 0;
  MATROSKA_ContextBlockAddIDName.DefaultValue = 0;
  MATROSKA_ContextBlockAddIDName.ElementName = "BlockAddIDName";
  MATROSKA_ContextBlockAddIDName.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockAddIDType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAddIDType.Id = 0x41e7;
  MATROSKA_ContextBlockAddIDType.Class = 0x54494245;
  MATROSKA_ContextBlockAddIDType.HasDefault = 1;
  MATROSKA_ContextBlockAddIDType.DefaultValue = 0;
  MATROSKA_ContextBlockAddIDType.ElementName = "BlockAddIDType";
  MATROSKA_ContextBlockAddIDType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockAddIDExtraData.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAddIDExtraData.Id = 0x41ed;
  MATROSKA_ContextBlockAddIDExtraData.Class = 0x4e494245;
  MATROSKA_ContextBlockAddIDExtraData.HasDefault = 0;
  MATROSKA_ContextBlockAddIDExtraData.DefaultValue = 0;
  MATROSKA_ContextBlockAddIDExtraData.ElementName = "BlockAddIDExtraData";
  MATROSKA_ContextBlockAddIDExtraData.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBlockAdditionMapping.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBlockAdditionMapping.Id = 0x41e4;
  MATROSKA_ContextBlockAdditionMapping.Class = 0x544d4245;
  MATROSKA_ContextBlockAdditionMapping.HasDefault = 0;
  MATROSKA_ContextBlockAdditionMapping.DefaultValue = 0;
  MATROSKA_ContextBlockAdditionMapping.ElementName = "BlockAdditionMapping";
  MATROSKA_ContextBlockAdditionMapping.Semantic = EBML_SemanticBlockAdditionMapping;
  MATROSKA_ContextName.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextName.Id = 0x536e;
  MATROSKA_ContextName.Class = 0x55534245;
  MATROSKA_ContextName.HasDefault = 0;
  MATROSKA_ContextName.DefaultValue = 0;
  MATROSKA_ContextName.ElementName = "Name";
  MATROSKA_ContextName.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextLanguage.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextLanguage.Id = 0x22b59c;
  MATROSKA_ContextLanguage.Class = 0x47534245;
  MATROSKA_ContextLanguage.HasDefault = 1;
  MATROSKA_ContextLanguage.DefaultValue = (intptr_t)anon_var_dwarf_117cc;
  MATROSKA_ContextLanguage.ElementName = "Language";
  MATROSKA_ContextLanguage.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextLanguageBCP47.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextLanguageBCP47.Id = 0x22b59d;
  MATROSKA_ContextLanguageBCP47.Class = 0x47534245;
  MATROSKA_ContextLanguageBCP47.HasDefault = 0;
  MATROSKA_ContextLanguageBCP47.DefaultValue = 0;
  MATROSKA_ContextLanguageBCP47.ElementName = "LanguageBCP47";
  MATROSKA_ContextLanguageBCP47.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecID.Id = 0x86;
  MATROSKA_ContextCodecID.Class = 0x47534245;
  MATROSKA_ContextCodecID.HasDefault = 0;
  MATROSKA_ContextCodecID.DefaultValue = 0;
  MATROSKA_ContextCodecID.ElementName = "CodecID";
  MATROSKA_ContextCodecID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecPrivate.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecPrivate.Id = 0x63a2;
  MATROSKA_ContextCodecPrivate.Class = 0x4e494245;
  MATROSKA_ContextCodecPrivate.HasDefault = 0;
  MATROSKA_ContextCodecPrivate.DefaultValue = 0;
  MATROSKA_ContextCodecPrivate.ElementName = "CodecPrivate";
  MATROSKA_ContextCodecPrivate.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecName.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecName.Id = 0x258688;
  MATROSKA_ContextCodecName.Class = 0x55534245;
  MATROSKA_ContextCodecName.HasDefault = 0;
  MATROSKA_ContextCodecName.DefaultValue = 0;
  MATROSKA_ContextCodecName.ElementName = "CodecName";
  MATROSKA_ContextCodecName.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextAttachmentLink.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextAttachmentLink.Id = 0x7446;
  MATROSKA_ContextAttachmentLink.Class = 0x54494245;
  MATROSKA_ContextAttachmentLink.HasDefault = 0;
  MATROSKA_ContextAttachmentLink.DefaultValue = 0;
  MATROSKA_ContextAttachmentLink.ElementName = "AttachmentLink";
  MATROSKA_ContextAttachmentLink.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecSettings.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecSettings.Id = 0x3a9697;
  MATROSKA_ContextCodecSettings.Class = 0x55534245;
  MATROSKA_ContextCodecSettings.HasDefault = 0;
  MATROSKA_ContextCodecSettings.DefaultValue = 0;
  MATROSKA_ContextCodecSettings.ElementName = "CodecSettings";
  MATROSKA_ContextCodecSettings.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecInfoURL.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecInfoURL.Id = 0x3b4040;
  MATROSKA_ContextCodecInfoURL.Class = 0x47534245;
  MATROSKA_ContextCodecInfoURL.HasDefault = 0;
  MATROSKA_ContextCodecInfoURL.DefaultValue = 0;
  MATROSKA_ContextCodecInfoURL.ElementName = "CodecInfoURL";
  MATROSKA_ContextCodecInfoURL.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecDownloadURL.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecDownloadURL.Id = 0x26b240;
  MATROSKA_ContextCodecDownloadURL.Class = 0x47534245;
  MATROSKA_ContextCodecDownloadURL.HasDefault = 0;
  MATROSKA_ContextCodecDownloadURL.DefaultValue = 0;
  MATROSKA_ContextCodecDownloadURL.ElementName = "CodecDownloadURL";
  MATROSKA_ContextCodecDownloadURL.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecDecodeAll.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecDecodeAll.Id = 0xaa;
  MATROSKA_ContextCodecDecodeAll.Class = 0x4f424245;
  MATROSKA_ContextCodecDecodeAll.HasDefault = 1;
  MATROSKA_ContextCodecDecodeAll.DefaultValue = 1;
  MATROSKA_ContextCodecDecodeAll.ElementName = "CodecDecodeAll";
  MATROSKA_ContextCodecDecodeAll.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackOverlay.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackOverlay.Id = 0x6fab;
  MATROSKA_ContextTrackOverlay.Class = 0x54494245;
  MATROSKA_ContextTrackOverlay.HasDefault = 0;
  MATROSKA_ContextTrackOverlay.DefaultValue = 0;
  MATROSKA_ContextTrackOverlay.ElementName = "TrackOverlay";
  MATROSKA_ContextTrackOverlay.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCodecDelay.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCodecDelay.Id = 0x56aa;
  MATROSKA_ContextCodecDelay.Class = 0x54494245;
  MATROSKA_ContextCodecDelay.HasDefault = 1;
  MATROSKA_ContextCodecDelay.DefaultValue = 0;
  MATROSKA_ContextCodecDelay.ElementName = "CodecDelay";
  MATROSKA_ContextCodecDelay.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSeekPreRoll.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSeekPreRoll.Id = 0x56bb;
  MATROSKA_ContextSeekPreRoll.Class = 0x54494245;
  MATROSKA_ContextSeekPreRoll.HasDefault = 1;
  MATROSKA_ContextSeekPreRoll.DefaultValue = 0;
  MATROSKA_ContextSeekPreRoll.ElementName = "SeekPreRoll";
  MATROSKA_ContextSeekPreRoll.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackTranslateTrackID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackTranslateTrackID.Id = 0x66a5;
  MATROSKA_ContextTrackTranslateTrackID.Class = 0x4e494245;
  MATROSKA_ContextTrackTranslateTrackID.HasDefault = 0;
  MATROSKA_ContextTrackTranslateTrackID.DefaultValue = 0;
  MATROSKA_ContextTrackTranslateTrackID.ElementName = "TrackTranslateTrackID";
  MATROSKA_ContextTrackTranslateTrackID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackTranslateCodec.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackTranslateCodec.Id = 0x66bf;
  MATROSKA_ContextTrackTranslateCodec.Class = 0x54494245;
  MATROSKA_ContextTrackTranslateCodec.HasDefault = 0;
  MATROSKA_ContextTrackTranslateCodec.DefaultValue = 0;
  MATROSKA_ContextTrackTranslateCodec.ElementName = "TrackTranslateCodec";
  MATROSKA_ContextTrackTranslateCodec.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackTranslateEditionUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackTranslateEditionUID.Id = 0x66fc;
  MATROSKA_ContextTrackTranslateEditionUID.Class = 0x54494245;
  MATROSKA_ContextTrackTranslateEditionUID.HasDefault = 0;
  MATROSKA_ContextTrackTranslateEditionUID.DefaultValue = 0;
  MATROSKA_ContextTrackTranslateEditionUID.ElementName = "TrackTranslateEditionUID";
  MATROSKA_ContextTrackTranslateEditionUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackTranslate.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackTranslate.Id = 0x6624;
  MATROSKA_ContextTrackTranslate.Class = 0x544d4245;
  MATROSKA_ContextTrackTranslate.HasDefault = 0;
  MATROSKA_ContextTrackTranslate.DefaultValue = 0;
  MATROSKA_ContextTrackTranslate.ElementName = "TrackTranslate";
  MATROSKA_ContextTrackTranslate.Semantic = EBML_SemanticTrackTranslate;
  MATROSKA_ContextFlagInterlaced.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFlagInterlaced.Id = 0x9a;
  MATROSKA_ContextFlagInterlaced.Class = 0x54494245;
  MATROSKA_ContextFlagInterlaced.HasDefault = 1;
  MATROSKA_ContextFlagInterlaced.DefaultValue = 0;
  MATROSKA_ContextFlagInterlaced.ElementName = "FlagInterlaced";
  MATROSKA_ContextFlagInterlaced.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFieldOrder.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFieldOrder.Id = 0x9d;
  MATROSKA_ContextFieldOrder.Class = 0x54494245;
  MATROSKA_ContextFieldOrder.HasDefault = 1;
  MATROSKA_ContextFieldOrder.DefaultValue = 2;
  MATROSKA_ContextFieldOrder.ElementName = "FieldOrder";
  MATROSKA_ContextFieldOrder.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextStereoMode.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextStereoMode.Id = 0x53b8;
  MATROSKA_ContextStereoMode.Class = 0x54494245;
  MATROSKA_ContextStereoMode.HasDefault = 1;
  MATROSKA_ContextStereoMode.DefaultValue = 0;
  MATROSKA_ContextStereoMode.ElementName = "StereoMode";
  MATROSKA_ContextStereoMode.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextAlphaMode.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextAlphaMode.Id = 0x53c0;
  MATROSKA_ContextAlphaMode.Class = 0x54494245;
  MATROSKA_ContextAlphaMode.HasDefault = 1;
  MATROSKA_ContextAlphaMode.DefaultValue = 0;
  MATROSKA_ContextAlphaMode.ElementName = "AlphaMode";
  MATROSKA_ContextAlphaMode.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextOldStereoMode.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextOldStereoMode.Id = 0x53b9;
  MATROSKA_ContextOldStereoMode.Class = 0x54494245;
  MATROSKA_ContextOldStereoMode.HasDefault = 0;
  MATROSKA_ContextOldStereoMode.DefaultValue = 0;
  MATROSKA_ContextOldStereoMode.ElementName = "OldStereoMode";
  MATROSKA_ContextOldStereoMode.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPixelWidth.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPixelWidth.Id = 0xb0;
  MATROSKA_ContextPixelWidth.Class = 0x54494245;
  MATROSKA_ContextPixelWidth.HasDefault = 0;
  MATROSKA_ContextPixelWidth.DefaultValue = 0;
  MATROSKA_ContextPixelWidth.ElementName = "PixelWidth";
  MATROSKA_ContextPixelWidth.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPixelHeight.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPixelHeight.Id = 0xba;
  MATROSKA_ContextPixelHeight.Class = 0x54494245;
  MATROSKA_ContextPixelHeight.HasDefault = 0;
  MATROSKA_ContextPixelHeight.DefaultValue = 0;
  MATROSKA_ContextPixelHeight.ElementName = "PixelHeight";
  MATROSKA_ContextPixelHeight.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPixelCropBottom.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPixelCropBottom.Id = 0x54aa;
  MATROSKA_ContextPixelCropBottom.Class = 0x54494245;
  MATROSKA_ContextPixelCropBottom.HasDefault = 1;
  MATROSKA_ContextPixelCropBottom.DefaultValue = 0;
  MATROSKA_ContextPixelCropBottom.ElementName = "PixelCropBottom";
  MATROSKA_ContextPixelCropBottom.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPixelCropTop.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPixelCropTop.Id = 0x54bb;
  MATROSKA_ContextPixelCropTop.Class = 0x54494245;
  MATROSKA_ContextPixelCropTop.HasDefault = 1;
  MATROSKA_ContextPixelCropTop.DefaultValue = 0;
  MATROSKA_ContextPixelCropTop.ElementName = "PixelCropTop";
  MATROSKA_ContextPixelCropTop.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPixelCropLeft.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPixelCropLeft.Id = 0x54cc;
  MATROSKA_ContextPixelCropLeft.Class = 0x54494245;
  MATROSKA_ContextPixelCropLeft.HasDefault = 1;
  MATROSKA_ContextPixelCropLeft.DefaultValue = 0;
  MATROSKA_ContextPixelCropLeft.ElementName = "PixelCropLeft";
  MATROSKA_ContextPixelCropLeft.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPixelCropRight.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPixelCropRight.Id = 0x54dd;
  MATROSKA_ContextPixelCropRight.Class = 0x54494245;
  MATROSKA_ContextPixelCropRight.HasDefault = 1;
  MATROSKA_ContextPixelCropRight.DefaultValue = 0;
  MATROSKA_ContextPixelCropRight.ElementName = "PixelCropRight";
  MATROSKA_ContextPixelCropRight.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDisplayWidth.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDisplayWidth.Id = 0x54b0;
  MATROSKA_ContextDisplayWidth.Class = 0x54494245;
  MATROSKA_ContextDisplayWidth.HasDefault = 0;
  MATROSKA_ContextDisplayWidth.DefaultValue = 0;
  MATROSKA_ContextDisplayWidth.ElementName = "DisplayWidth";
  MATROSKA_ContextDisplayWidth.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDisplayHeight.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDisplayHeight.Id = 0x54ba;
  MATROSKA_ContextDisplayHeight.Class = 0x54494245;
  MATROSKA_ContextDisplayHeight.HasDefault = 0;
  MATROSKA_ContextDisplayHeight.DefaultValue = 0;
  MATROSKA_ContextDisplayHeight.ElementName = "DisplayHeight";
  MATROSKA_ContextDisplayHeight.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextDisplayUnit.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextDisplayUnit.Id = 0x54b2;
  MATROSKA_ContextDisplayUnit.Class = 0x54494245;
  MATROSKA_ContextDisplayUnit.HasDefault = 1;
  MATROSKA_ContextDisplayUnit.DefaultValue = 0;
  MATROSKA_ContextDisplayUnit.ElementName = "DisplayUnit";
  MATROSKA_ContextDisplayUnit.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextAspectRatioType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextAspectRatioType.Id = 0x54b3;
  MATROSKA_ContextAspectRatioType.Class = 0x54494245;
  MATROSKA_ContextAspectRatioType.HasDefault = 1;
  MATROSKA_ContextAspectRatioType.DefaultValue = 0;
  MATROSKA_ContextAspectRatioType.ElementName = "AspectRatioType";
  MATROSKA_ContextAspectRatioType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextUncompressedFourCC.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextUncompressedFourCC.Id = 0x2eb524;
  MATROSKA_ContextUncompressedFourCC.Class = 0x4e494245;
  MATROSKA_ContextUncompressedFourCC.HasDefault = 0;
  MATROSKA_ContextUncompressedFourCC.DefaultValue = 0;
  MATROSKA_ContextUncompressedFourCC.ElementName = "UncompressedFourCC";
  MATROSKA_ContextUncompressedFourCC.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextGammaValue.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextGammaValue.Id = 0x2fb523;
  MATROSKA_ContextGammaValue.Class = 0x4c464245;
  MATROSKA_ContextGammaValue.HasDefault = 0;
  MATROSKA_ContextGammaValue.DefaultValue = 0;
  MATROSKA_ContextGammaValue.ElementName = "GammaValue";
  MATROSKA_ContextGammaValue.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFrameRate.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFrameRate.Id = 0x2383e3;
  MATROSKA_ContextFrameRate.Class = 0x4c464245;
  MATROSKA_ContextFrameRate.HasDefault = 0;
  MATROSKA_ContextFrameRate.DefaultValue = 0;
  MATROSKA_ContextFrameRate.ElementName = "FrameRate";
  MATROSKA_ContextFrameRate.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextMatrixCoefficients.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextMatrixCoefficients.Id = 0x55b1;
  MATROSKA_ContextMatrixCoefficients.Class = 0x54494245;
  MATROSKA_ContextMatrixCoefficients.HasDefault = 1;
  MATROSKA_ContextMatrixCoefficients.DefaultValue = 2;
  MATROSKA_ContextMatrixCoefficients.ElementName = "MatrixCoefficients";
  MATROSKA_ContextMatrixCoefficients.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBitsPerChannel.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBitsPerChannel.Id = 0x55b2;
  MATROSKA_ContextBitsPerChannel.Class = 0x54494245;
  MATROSKA_ContextBitsPerChannel.HasDefault = 1;
  MATROSKA_ContextBitsPerChannel.DefaultValue = 0;
  MATROSKA_ContextBitsPerChannel.ElementName = "BitsPerChannel";
  MATROSKA_ContextBitsPerChannel.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChromaSubsamplingHorz.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChromaSubsamplingHorz.Id = 0x55b3;
  MATROSKA_ContextChromaSubsamplingHorz.Class = 0x54494245;
  MATROSKA_ContextChromaSubsamplingHorz.HasDefault = 0;
  MATROSKA_ContextChromaSubsamplingHorz.DefaultValue = 0;
  MATROSKA_ContextChromaSubsamplingHorz.ElementName = "ChromaSubsamplingHorz";
  MATROSKA_ContextChromaSubsamplingHorz.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChromaSubsamplingVert.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChromaSubsamplingVert.Id = 0x55b4;
  MATROSKA_ContextChromaSubsamplingVert.Class = 0x54494245;
  MATROSKA_ContextChromaSubsamplingVert.HasDefault = 0;
  MATROSKA_ContextChromaSubsamplingVert.DefaultValue = 0;
  MATROSKA_ContextChromaSubsamplingVert.ElementName = "ChromaSubsamplingVert";
  MATROSKA_ContextChromaSubsamplingVert.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCbSubsamplingHorz.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCbSubsamplingHorz.Id = 0x55b5;
  MATROSKA_ContextCbSubsamplingHorz.Class = 0x54494245;
  MATROSKA_ContextCbSubsamplingHorz.HasDefault = 0;
  MATROSKA_ContextCbSubsamplingHorz.DefaultValue = 0;
  MATROSKA_ContextCbSubsamplingHorz.ElementName = "CbSubsamplingHorz";
  MATROSKA_ContextCbSubsamplingHorz.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCbSubsamplingVert.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCbSubsamplingVert.Id = 0x55b6;
  MATROSKA_ContextCbSubsamplingVert.Class = 0x54494245;
  MATROSKA_ContextCbSubsamplingVert.HasDefault = 0;
  MATROSKA_ContextCbSubsamplingVert.DefaultValue = 0;
  MATROSKA_ContextCbSubsamplingVert.ElementName = "CbSubsamplingVert";
  MATROSKA_ContextCbSubsamplingVert.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChromaSitingHorz.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChromaSitingHorz.Id = 0x55b7;
  MATROSKA_ContextChromaSitingHorz.Class = 0x54494245;
  MATROSKA_ContextChromaSitingHorz.HasDefault = 1;
  MATROSKA_ContextChromaSitingHorz.DefaultValue = 0;
  MATROSKA_ContextChromaSitingHorz.ElementName = "ChromaSitingHorz";
  MATROSKA_ContextChromaSitingHorz.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChromaSitingVert.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChromaSitingVert.Id = 0x55b8;
  MATROSKA_ContextChromaSitingVert.Class = 0x54494245;
  MATROSKA_ContextChromaSitingVert.HasDefault = 1;
  MATROSKA_ContextChromaSitingVert.DefaultValue = 0;
  MATROSKA_ContextChromaSitingVert.ElementName = "ChromaSitingVert";
  MATROSKA_ContextChromaSitingVert.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextRange.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextRange.Id = 0x55b9;
  MATROSKA_ContextRange.Class = 0x54494245;
  MATROSKA_ContextRange.HasDefault = 1;
  MATROSKA_ContextRange.DefaultValue = 0;
  MATROSKA_ContextRange.ElementName = "Range";
  MATROSKA_ContextRange.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTransferCharacteristics.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTransferCharacteristics.Id = 0x55ba;
  MATROSKA_ContextTransferCharacteristics.Class = 0x54494245;
  MATROSKA_ContextTransferCharacteristics.HasDefault = 1;
  MATROSKA_ContextTransferCharacteristics.DefaultValue = 2;
  MATROSKA_ContextTransferCharacteristics.ElementName = "TransferCharacteristics";
  MATROSKA_ContextTransferCharacteristics.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrimaries.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrimaries.Id = 0x55bb;
  MATROSKA_ContextPrimaries.Class = 0x54494245;
  MATROSKA_ContextPrimaries.HasDefault = 1;
  MATROSKA_ContextPrimaries.DefaultValue = 2;
  MATROSKA_ContextPrimaries.ElementName = "Primaries";
  MATROSKA_ContextPrimaries.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextMaxCLL.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextMaxCLL.Id = 0x55bc;
  MATROSKA_ContextMaxCLL.Class = 0x54494245;
  MATROSKA_ContextMaxCLL.HasDefault = 0;
  MATROSKA_ContextMaxCLL.DefaultValue = 0;
  MATROSKA_ContextMaxCLL.ElementName = "MaxCLL";
  MATROSKA_ContextMaxCLL.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextMaxFALL.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextMaxFALL.Id = 0x55bd;
  MATROSKA_ContextMaxFALL.Class = 0x54494245;
  MATROSKA_ContextMaxFALL.HasDefault = 0;
  MATROSKA_ContextMaxFALL.DefaultValue = 0;
  MATROSKA_ContextMaxFALL.ElementName = "MaxFALL";
  MATROSKA_ContextMaxFALL.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrimaryRChromaticityX.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrimaryRChromaticityX.Id = 0x55d1;
  MATROSKA_ContextPrimaryRChromaticityX.Class = 0x4c464245;
  MATROSKA_ContextPrimaryRChromaticityX.HasDefault = 0;
  MATROSKA_ContextPrimaryRChromaticityX.DefaultValue = 0;
  MATROSKA_ContextPrimaryRChromaticityX.ElementName = "PrimaryRChromaticityX";
  MATROSKA_ContextPrimaryRChromaticityX.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrimaryRChromaticityY.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrimaryRChromaticityY.Id = 0x55d2;
  MATROSKA_ContextPrimaryRChromaticityY.Class = 0x4c464245;
  MATROSKA_ContextPrimaryRChromaticityY.HasDefault = 0;
  MATROSKA_ContextPrimaryRChromaticityY.DefaultValue = 0;
  MATROSKA_ContextPrimaryRChromaticityY.ElementName = "PrimaryRChromaticityY";
  MATROSKA_ContextPrimaryRChromaticityY.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrimaryGChromaticityX.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrimaryGChromaticityX.Id = 0x55d3;
  MATROSKA_ContextPrimaryGChromaticityX.Class = 0x4c464245;
  MATROSKA_ContextPrimaryGChromaticityX.HasDefault = 0;
  MATROSKA_ContextPrimaryGChromaticityX.DefaultValue = 0;
  MATROSKA_ContextPrimaryGChromaticityX.ElementName = "PrimaryGChromaticityX";
  MATROSKA_ContextPrimaryGChromaticityX.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrimaryGChromaticityY.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrimaryGChromaticityY.Id = 0x55d4;
  MATROSKA_ContextPrimaryGChromaticityY.Class = 0x4c464245;
  MATROSKA_ContextPrimaryGChromaticityY.HasDefault = 0;
  MATROSKA_ContextPrimaryGChromaticityY.DefaultValue = 0;
  MATROSKA_ContextPrimaryGChromaticityY.ElementName = "PrimaryGChromaticityY";
  MATROSKA_ContextPrimaryGChromaticityY.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrimaryBChromaticityX.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrimaryBChromaticityX.Id = 0x55d5;
  MATROSKA_ContextPrimaryBChromaticityX.Class = 0x4c464245;
  MATROSKA_ContextPrimaryBChromaticityX.HasDefault = 0;
  MATROSKA_ContextPrimaryBChromaticityX.DefaultValue = 0;
  MATROSKA_ContextPrimaryBChromaticityX.ElementName = "PrimaryBChromaticityX";
  MATROSKA_ContextPrimaryBChromaticityX.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextPrimaryBChromaticityY.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextPrimaryBChromaticityY.Id = 0x55d6;
  MATROSKA_ContextPrimaryBChromaticityY.Class = 0x4c464245;
  MATROSKA_ContextPrimaryBChromaticityY.HasDefault = 0;
  MATROSKA_ContextPrimaryBChromaticityY.DefaultValue = 0;
  MATROSKA_ContextPrimaryBChromaticityY.ElementName = "PrimaryBChromaticityY";
  MATROSKA_ContextPrimaryBChromaticityY.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextWhitePointChromaticityX.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextWhitePointChromaticityX.Id = 0x55d7;
  MATROSKA_ContextWhitePointChromaticityX.Class = 0x4c464245;
  MATROSKA_ContextWhitePointChromaticityX.HasDefault = 0;
  MATROSKA_ContextWhitePointChromaticityX.DefaultValue = 0;
  MATROSKA_ContextWhitePointChromaticityX.ElementName = "WhitePointChromaticityX";
  MATROSKA_ContextWhitePointChromaticityX.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextWhitePointChromaticityY.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextWhitePointChromaticityY.Id = 0x55d8;
  MATROSKA_ContextWhitePointChromaticityY.Class = 0x4c464245;
  MATROSKA_ContextWhitePointChromaticityY.HasDefault = 0;
  MATROSKA_ContextWhitePointChromaticityY.DefaultValue = 0;
  MATROSKA_ContextWhitePointChromaticityY.ElementName = "WhitePointChromaticityY";
  MATROSKA_ContextWhitePointChromaticityY.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextLuminanceMax.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextLuminanceMax.Id = 0x55d9;
  MATROSKA_ContextLuminanceMax.Class = 0x4c464245;
  MATROSKA_ContextLuminanceMax.HasDefault = 0;
  MATROSKA_ContextLuminanceMax.DefaultValue = 0;
  MATROSKA_ContextLuminanceMax.ElementName = "LuminanceMax";
  MATROSKA_ContextLuminanceMax.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextLuminanceMin.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextLuminanceMin.Id = 0x55da;
  MATROSKA_ContextLuminanceMin.Class = 0x4c464245;
  MATROSKA_ContextLuminanceMin.HasDefault = 0;
  MATROSKA_ContextLuminanceMin.DefaultValue = 0;
  MATROSKA_ContextLuminanceMin.ElementName = "LuminanceMin";
  MATROSKA_ContextLuminanceMin.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextMasteringMetadata.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextMasteringMetadata.Id = 0x55d0;
  MATROSKA_ContextMasteringMetadata.Class = 0x544d4245;
  MATROSKA_ContextMasteringMetadata.HasDefault = 0;
  MATROSKA_ContextMasteringMetadata.DefaultValue = 0;
  MATROSKA_ContextMasteringMetadata.ElementName = "MasteringMetadata";
  MATROSKA_ContextMasteringMetadata.Semantic = EBML_SemanticMasteringMetadata;
  MATROSKA_ContextColour.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextColour.Id = 0x55b0;
  MATROSKA_ContextColour.Class = 0x544d4245;
  MATROSKA_ContextColour.HasDefault = 0;
  MATROSKA_ContextColour.DefaultValue = 0;
  MATROSKA_ContextColour.ElementName = "Colour";
  MATROSKA_ContextColour.Semantic = EBML_SemanticColour;
  MATROSKA_ContextProjectionType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextProjectionType.Id = 0x7671;
  MATROSKA_ContextProjectionType.Class = 0x54494245;
  MATROSKA_ContextProjectionType.HasDefault = 1;
  MATROSKA_ContextProjectionType.DefaultValue = 0;
  MATROSKA_ContextProjectionType.ElementName = "ProjectionType";
  MATROSKA_ContextProjectionType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextProjectionPrivate.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextProjectionPrivate.Id = 0x7672;
  MATROSKA_ContextProjectionPrivate.Class = 0x4e494245;
  MATROSKA_ContextProjectionPrivate.HasDefault = 0;
  MATROSKA_ContextProjectionPrivate.DefaultValue = 0;
  MATROSKA_ContextProjectionPrivate.ElementName = "ProjectionPrivate";
  MATROSKA_ContextProjectionPrivate.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextProjectionPoseYaw.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextProjectionPoseYaw.Id = 0x7673;
  MATROSKA_ContextProjectionPoseYaw.Class = 0x4c464245;
  MATROSKA_ContextProjectionPoseYaw.HasDefault = 1;
  MATROSKA_ContextProjectionPoseYaw.DefaultValue = 0;
  MATROSKA_ContextProjectionPoseYaw.ElementName = "ProjectionPoseYaw";
  MATROSKA_ContextProjectionPoseYaw.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextProjectionPosePitch.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextProjectionPosePitch.Id = 0x7674;
  MATROSKA_ContextProjectionPosePitch.Class = 0x4c464245;
  MATROSKA_ContextProjectionPosePitch.HasDefault = 1;
  MATROSKA_ContextProjectionPosePitch.DefaultValue = 0;
  MATROSKA_ContextProjectionPosePitch.ElementName = "ProjectionPosePitch";
  MATROSKA_ContextProjectionPosePitch.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextProjectionPoseRoll.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextProjectionPoseRoll.Id = 0x7675;
  MATROSKA_ContextProjectionPoseRoll.Class = 0x4c464245;
  MATROSKA_ContextProjectionPoseRoll.HasDefault = 1;
  MATROSKA_ContextProjectionPoseRoll.DefaultValue = 0;
  MATROSKA_ContextProjectionPoseRoll.ElementName = "ProjectionPoseRoll";
  MATROSKA_ContextProjectionPoseRoll.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextProjection.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextProjection.Id = 0x7670;
  MATROSKA_ContextProjection.Class = 0x544d4245;
  MATROSKA_ContextProjection.HasDefault = 0;
  MATROSKA_ContextProjection.DefaultValue = 0;
  MATROSKA_ContextProjection.ElementName = "Projection";
  MATROSKA_ContextProjection.Semantic = EBML_SemanticProjection;
  MATROSKA_ContextVideo.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextVideo.Id = 0xe0;
  MATROSKA_ContextVideo.Class = 0x544d4245;
  MATROSKA_ContextVideo.HasDefault = 0;
  MATROSKA_ContextVideo.DefaultValue = 0;
  MATROSKA_ContextVideo.ElementName = "Video";
  MATROSKA_ContextVideo.Semantic = EBML_SemanticVideo;
  MATROSKA_ContextSamplingFrequency.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSamplingFrequency.Id = 0xb5;
  MATROSKA_ContextSamplingFrequency.Class = 0x4c464245;
  MATROSKA_ContextSamplingFrequency.HasDefault = 1;
  MATROSKA_ContextSamplingFrequency.DefaultValue = 8000;
  MATROSKA_ContextSamplingFrequency.ElementName = "SamplingFrequency";
  MATROSKA_ContextSamplingFrequency.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextOutputSamplingFrequency.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextOutputSamplingFrequency.Id = 0x78b5;
  MATROSKA_ContextOutputSamplingFrequency.Class = 0x4c464245;
  MATROSKA_ContextOutputSamplingFrequency.HasDefault = 0;
  MATROSKA_ContextOutputSamplingFrequency.DefaultValue = 0;
  MATROSKA_ContextOutputSamplingFrequency.ElementName = "OutputSamplingFrequency";
  MATROSKA_ContextOutputSamplingFrequency.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChannels.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChannels.Id = 0x9f;
  MATROSKA_ContextChannels.Class = 0x54494245;
  MATROSKA_ContextChannels.HasDefault = 1;
  MATROSKA_ContextChannels.DefaultValue = 1;
  MATROSKA_ContextChannels.ElementName = "Channels";
  MATROSKA_ContextChannels.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChannelPositions.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChannelPositions.Id = 0x7d7b;
  MATROSKA_ContextChannelPositions.Class = 0x4e494245;
  MATROSKA_ContextChannelPositions.HasDefault = 0;
  MATROSKA_ContextChannelPositions.DefaultValue = 0;
  MATROSKA_ContextChannelPositions.ElementName = "ChannelPositions";
  MATROSKA_ContextChannelPositions.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextBitDepth.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextBitDepth.Id = 0x6264;
  MATROSKA_ContextBitDepth.Class = 0x54494245;
  MATROSKA_ContextBitDepth.HasDefault = 0;
  MATROSKA_ContextBitDepth.DefaultValue = 0;
  MATROSKA_ContextBitDepth.ElementName = "BitDepth";
  MATROSKA_ContextBitDepth.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextEmphasis.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEmphasis.Id = 0x52f1;
  MATROSKA_ContextEmphasis.Class = 0x54494245;
  MATROSKA_ContextEmphasis.HasDefault = 1;
  MATROSKA_ContextEmphasis.DefaultValue = 0;
  MATROSKA_ContextEmphasis.ElementName = "Emphasis";
  MATROSKA_ContextEmphasis.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextAudio.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextAudio.Id = 0xe1;
  MATROSKA_ContextAudio.Class = 0x544d4245;
  MATROSKA_ContextAudio.HasDefault = 0;
  MATROSKA_ContextAudio.DefaultValue = 0;
  MATROSKA_ContextAudio.ElementName = "Audio";
  MATROSKA_ContextAudio.Semantic = EBML_SemanticAudio;
  MATROSKA_ContextTrackPlaneUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackPlaneUID.Id = 0xe5;
  MATROSKA_ContextTrackPlaneUID.Class = 0x54494245;
  MATROSKA_ContextTrackPlaneUID.HasDefault = 0;
  MATROSKA_ContextTrackPlaneUID.DefaultValue = 0;
  MATROSKA_ContextTrackPlaneUID.ElementName = "TrackPlaneUID";
  MATROSKA_ContextTrackPlaneUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackPlaneType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackPlaneType.Id = 0xe6;
  MATROSKA_ContextTrackPlaneType.Class = 0x54494245;
  MATROSKA_ContextTrackPlaneType.HasDefault = 0;
  MATROSKA_ContextTrackPlaneType.DefaultValue = 0;
  MATROSKA_ContextTrackPlaneType.ElementName = "TrackPlaneType";
  MATROSKA_ContextTrackPlaneType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackPlane.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackPlane.Id = 0xe4;
  MATROSKA_ContextTrackPlane.Class = 0x544d4245;
  MATROSKA_ContextTrackPlane.HasDefault = 0;
  MATROSKA_ContextTrackPlane.DefaultValue = 0;
  MATROSKA_ContextTrackPlane.ElementName = "TrackPlane";
  MATROSKA_ContextTrackPlane.Semantic = EBML_SemanticTrackPlane;
  MATROSKA_ContextTrackCombinePlanes.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackCombinePlanes.Id = 0xe3;
  MATROSKA_ContextTrackCombinePlanes.Class = 0x544d4245;
  MATROSKA_ContextTrackCombinePlanes.HasDefault = 0;
  MATROSKA_ContextTrackCombinePlanes.DefaultValue = 0;
  MATROSKA_ContextTrackCombinePlanes.ElementName = "TrackCombinePlanes";
  MATROSKA_ContextTrackCombinePlanes.Semantic = EBML_SemanticTrackCombinePlanes;
  MATROSKA_ContextTrackJoinUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackJoinUID.Id = 0xed;
  MATROSKA_ContextTrackJoinUID.Class = 0x54494245;
  MATROSKA_ContextTrackJoinUID.HasDefault = 0;
  MATROSKA_ContextTrackJoinUID.DefaultValue = 0;
  MATROSKA_ContextTrackJoinUID.ElementName = "TrackJoinUID";
  MATROSKA_ContextTrackJoinUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrackJoinBlocks.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackJoinBlocks.Id = 0xe9;
  MATROSKA_ContextTrackJoinBlocks.Class = 0x544d4245;
  MATROSKA_ContextTrackJoinBlocks.HasDefault = 0;
  MATROSKA_ContextTrackJoinBlocks.DefaultValue = 0;
  MATROSKA_ContextTrackJoinBlocks.ElementName = "TrackJoinBlocks";
  MATROSKA_ContextTrackJoinBlocks.Semantic = EBML_SemanticTrackJoinBlocks;
  MATROSKA_ContextTrackOperation.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackOperation.Id = 0xe2;
  MATROSKA_ContextTrackOperation.Class = 0x544d4245;
  MATROSKA_ContextTrackOperation.HasDefault = 0;
  MATROSKA_ContextTrackOperation.DefaultValue = 0;
  MATROSKA_ContextTrackOperation.ElementName = "TrackOperation";
  MATROSKA_ContextTrackOperation.Semantic = EBML_SemanticTrackOperation;
  MATROSKA_ContextTrickTrackUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrickTrackUID.Id = 0xc0;
  MATROSKA_ContextTrickTrackUID.Class = 0x54494245;
  MATROSKA_ContextTrickTrackUID.HasDefault = 0;
  MATROSKA_ContextTrickTrackUID.DefaultValue = 0;
  MATROSKA_ContextTrickTrackUID.ElementName = "TrickTrackUID";
  MATROSKA_ContextTrickTrackUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrickTrackSegmentUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrickTrackSegmentUID.Id = 0xc1;
  MATROSKA_ContextTrickTrackSegmentUID.Class = 0x44494b4d;
  MATROSKA_ContextTrickTrackSegmentUID.HasDefault = 0;
  MATROSKA_ContextTrickTrackSegmentUID.DefaultValue = 0;
  MATROSKA_ContextTrickTrackSegmentUID.ElementName = "TrickTrackSegmentUID";
  MATROSKA_ContextTrickTrackSegmentUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrickTrackFlag.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrickTrackFlag.Id = 0xc6;
  MATROSKA_ContextTrickTrackFlag.Class = 0x54494245;
  MATROSKA_ContextTrickTrackFlag.HasDefault = 1;
  MATROSKA_ContextTrickTrackFlag.DefaultValue = 0;
  MATROSKA_ContextTrickTrackFlag.ElementName = "TrickTrackFlag";
  MATROSKA_ContextTrickTrackFlag.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrickMasterTrackUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrickMasterTrackUID.Id = 199;
  MATROSKA_ContextTrickMasterTrackUID.Class = 0x54494245;
  MATROSKA_ContextTrickMasterTrackUID.HasDefault = 0;
  MATROSKA_ContextTrickMasterTrackUID.DefaultValue = 0;
  MATROSKA_ContextTrickMasterTrackUID.ElementName = "TrickMasterTrackUID";
  MATROSKA_ContextTrickMasterTrackUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTrickMasterTrackSegmentUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrickMasterTrackSegmentUID.Id = 0xc4;
  MATROSKA_ContextTrickMasterTrackSegmentUID.Class = 0x44494b4d;
  MATROSKA_ContextTrickMasterTrackSegmentUID.HasDefault = 0;
  MATROSKA_ContextTrickMasterTrackSegmentUID.DefaultValue = 0;
  MATROSKA_ContextTrickMasterTrackSegmentUID.ElementName = "TrickMasterTrackSegmentUID";
  MATROSKA_ContextTrickMasterTrackSegmentUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentEncodingOrder.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncodingOrder.Id = 0x5031;
  MATROSKA_ContextContentEncodingOrder.Class = 0x54494245;
  MATROSKA_ContextContentEncodingOrder.HasDefault = 1;
  MATROSKA_ContextContentEncodingOrder.DefaultValue = 0;
  MATROSKA_ContextContentEncodingOrder.ElementName = "ContentEncodingOrder";
  MATROSKA_ContextContentEncodingOrder.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentEncodingScope.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncodingScope.Id = 0x5032;
  MATROSKA_ContextContentEncodingScope.Class = 0x54494245;
  MATROSKA_ContextContentEncodingScope.HasDefault = 1;
  MATROSKA_ContextContentEncodingScope.DefaultValue = 1;
  MATROSKA_ContextContentEncodingScope.ElementName = "ContentEncodingScope";
  MATROSKA_ContextContentEncodingScope.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentEncodingType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncodingType.Id = 0x5033;
  MATROSKA_ContextContentEncodingType.Class = 0x54494245;
  MATROSKA_ContextContentEncodingType.HasDefault = 1;
  MATROSKA_ContextContentEncodingType.DefaultValue = 0;
  MATROSKA_ContextContentEncodingType.ElementName = "ContentEncodingType";
  MATROSKA_ContextContentEncodingType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentCompAlgo.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentCompAlgo.Id = 0x4254;
  MATROSKA_ContextContentCompAlgo.Class = 0x54494245;
  MATROSKA_ContextContentCompAlgo.HasDefault = 1;
  MATROSKA_ContextContentCompAlgo.DefaultValue = 0;
  MATROSKA_ContextContentCompAlgo.ElementName = "ContentCompAlgo";
  MATROSKA_ContextContentCompAlgo.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentCompSettings.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentCompSettings.Id = 0x4255;
  MATROSKA_ContextContentCompSettings.Class = 0x4e494245;
  MATROSKA_ContextContentCompSettings.HasDefault = 0;
  MATROSKA_ContextContentCompSettings.DefaultValue = 0;
  MATROSKA_ContextContentCompSettings.ElementName = "ContentCompSettings";
  MATROSKA_ContextContentCompSettings.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentCompression.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentCompression.Id = 0x5034;
  MATROSKA_ContextContentCompression.Class = 0x544d4245;
  MATROSKA_ContextContentCompression.HasDefault = 0;
  MATROSKA_ContextContentCompression.DefaultValue = 0;
  MATROSKA_ContextContentCompression.ElementName = "ContentCompression";
  MATROSKA_ContextContentCompression.Semantic = EBML_SemanticContentCompression;
  MATROSKA_ContextContentEncAlgo.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncAlgo.Id = 0x47e1;
  MATROSKA_ContextContentEncAlgo.Class = 0x54494245;
  MATROSKA_ContextContentEncAlgo.HasDefault = 1;
  MATROSKA_ContextContentEncAlgo.DefaultValue = 0;
  MATROSKA_ContextContentEncAlgo.ElementName = "ContentEncAlgo";
  MATROSKA_ContextContentEncAlgo.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentEncKeyID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncKeyID.Id = 0x47e2;
  MATROSKA_ContextContentEncKeyID.Class = 0x4e494245;
  MATROSKA_ContextContentEncKeyID.HasDefault = 0;
  MATROSKA_ContextContentEncKeyID.DefaultValue = 0;
  MATROSKA_ContextContentEncKeyID.ElementName = "ContentEncKeyID";
  MATROSKA_ContextContentEncKeyID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextAESSettingsCipherMode.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextAESSettingsCipherMode.Id = 0x47e8;
  MATROSKA_ContextAESSettingsCipherMode.Class = 0x54494245;
  MATROSKA_ContextAESSettingsCipherMode.HasDefault = 0;
  MATROSKA_ContextAESSettingsCipherMode.DefaultValue = 0;
  MATROSKA_ContextAESSettingsCipherMode.ElementName = "AESSettingsCipherMode";
  MATROSKA_ContextAESSettingsCipherMode.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentEncAESSettings.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncAESSettings.Id = 0x47e7;
  MATROSKA_ContextContentEncAESSettings.Class = 0x544d4245;
  MATROSKA_ContextContentEncAESSettings.HasDefault = 0;
  MATROSKA_ContextContentEncAESSettings.DefaultValue = 0;
  MATROSKA_ContextContentEncAESSettings.ElementName = "ContentEncAESSettings";
  MATROSKA_ContextContentEncAESSettings.Semantic = EBML_SemanticContentEncAESSettings;
  MATROSKA_ContextContentSignature.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentSignature.Id = 0x47e3;
  MATROSKA_ContextContentSignature.Class = 0x4e494245;
  MATROSKA_ContextContentSignature.HasDefault = 0;
  MATROSKA_ContextContentSignature.DefaultValue = 0;
  MATROSKA_ContextContentSignature.ElementName = "ContentSignature";
  MATROSKA_ContextContentSignature.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentSigKeyID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentSigKeyID.Id = 0x47e4;
  MATROSKA_ContextContentSigKeyID.Class = 0x4e494245;
  MATROSKA_ContextContentSigKeyID.HasDefault = 0;
  MATROSKA_ContextContentSigKeyID.DefaultValue = 0;
  MATROSKA_ContextContentSigKeyID.ElementName = "ContentSigKeyID";
  MATROSKA_ContextContentSigKeyID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentSigAlgo.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentSigAlgo.Id = 0x47e5;
  MATROSKA_ContextContentSigAlgo.Class = 0x54494245;
  MATROSKA_ContextContentSigAlgo.HasDefault = 1;
  MATROSKA_ContextContentSigAlgo.DefaultValue = 0;
  MATROSKA_ContextContentSigAlgo.ElementName = "ContentSigAlgo";
  MATROSKA_ContextContentSigAlgo.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentSigHashAlgo.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentSigHashAlgo.Id = 0x47e6;
  MATROSKA_ContextContentSigHashAlgo.Class = 0x54494245;
  MATROSKA_ContextContentSigHashAlgo.HasDefault = 1;
  MATROSKA_ContextContentSigHashAlgo.DefaultValue = 0;
  MATROSKA_ContextContentSigHashAlgo.ElementName = "ContentSigHashAlgo";
  MATROSKA_ContextContentSigHashAlgo.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextContentEncryption.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncryption.Id = 0x5035;
  MATROSKA_ContextContentEncryption.Class = 0x544d4245;
  MATROSKA_ContextContentEncryption.HasDefault = 0;
  MATROSKA_ContextContentEncryption.DefaultValue = 0;
  MATROSKA_ContextContentEncryption.ElementName = "ContentEncryption";
  MATROSKA_ContextContentEncryption.Semantic = EBML_SemanticContentEncryption;
  MATROSKA_ContextContentEncoding.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncoding.Id = 0x6240;
  MATROSKA_ContextContentEncoding.Class = 0x544d4245;
  MATROSKA_ContextContentEncoding.HasDefault = 0;
  MATROSKA_ContextContentEncoding.DefaultValue = 0;
  MATROSKA_ContextContentEncoding.ElementName = "ContentEncoding";
  MATROSKA_ContextContentEncoding.Semantic = EBML_SemanticContentEncoding;
  MATROSKA_ContextContentEncodings.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextContentEncodings.Id = 0x6d80;
  MATROSKA_ContextContentEncodings.Class = 0x544d4245;
  MATROSKA_ContextContentEncodings.HasDefault = 0;
  MATROSKA_ContextContentEncodings.DefaultValue = 0;
  MATROSKA_ContextContentEncodings.ElementName = "ContentEncodings";
  MATROSKA_ContextContentEncodings.Semantic = EBML_SemanticContentEncodings;
  MATROSKA_ContextTrackEntry.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTrackEntry.Id = 0xae;
  MATROSKA_ContextTrackEntry.Class = 0x45544b4d;
  MATROSKA_ContextTrackEntry.HasDefault = 0;
  MATROSKA_ContextTrackEntry.DefaultValue = 0;
  MATROSKA_ContextTrackEntry.ElementName = "TrackEntry";
  MATROSKA_ContextTrackEntry.Semantic = EBML_SemanticTrackEntry;
  MATROSKA_ContextTracks.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTracks.Id = 0x1654ae6b;
  MATROSKA_ContextTracks.Class = 0x544d4245;
  MATROSKA_ContextTracks.HasDefault = 0;
  MATROSKA_ContextTracks.DefaultValue = 0;
  MATROSKA_ContextTracks.ElementName = "Tracks";
  MATROSKA_ContextTracks.Semantic = EBML_SemanticTracks;
  MATROSKA_ContextCueTime.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueTime.Id = 0xb3;
  MATROSKA_ContextCueTime.Class = 0x54494245;
  MATROSKA_ContextCueTime.HasDefault = 0;
  MATROSKA_ContextCueTime.DefaultValue = 0;
  MATROSKA_ContextCueTime.ElementName = "CueTime";
  MATROSKA_ContextCueTime.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueTrack.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueTrack.Id = 0xf7;
  MATROSKA_ContextCueTrack.Class = 0x54494245;
  MATROSKA_ContextCueTrack.HasDefault = 0;
  MATROSKA_ContextCueTrack.DefaultValue = 0;
  MATROSKA_ContextCueTrack.ElementName = "CueTrack";
  MATROSKA_ContextCueTrack.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueClusterPosition.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueClusterPosition.Id = 0xf1;
  MATROSKA_ContextCueClusterPosition.Class = 0x54494245;
  MATROSKA_ContextCueClusterPosition.HasDefault = 0;
  MATROSKA_ContextCueClusterPosition.DefaultValue = 0;
  MATROSKA_ContextCueClusterPosition.ElementName = "CueClusterPosition";
  MATROSKA_ContextCueClusterPosition.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueRelativePosition.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueRelativePosition.Id = 0xf0;
  MATROSKA_ContextCueRelativePosition.Class = 0x54494245;
  MATROSKA_ContextCueRelativePosition.HasDefault = 0;
  MATROSKA_ContextCueRelativePosition.DefaultValue = 0;
  MATROSKA_ContextCueRelativePosition.ElementName = "CueRelativePosition";
  MATROSKA_ContextCueRelativePosition.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueDuration.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueDuration.Id = 0xb2;
  MATROSKA_ContextCueDuration.Class = 0x54494245;
  MATROSKA_ContextCueDuration.HasDefault = 0;
  MATROSKA_ContextCueDuration.DefaultValue = 0;
  MATROSKA_ContextCueDuration.ElementName = "CueDuration";
  MATROSKA_ContextCueDuration.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueBlockNumber.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueBlockNumber.Id = 0x5378;
  MATROSKA_ContextCueBlockNumber.Class = 0x54494245;
  MATROSKA_ContextCueBlockNumber.HasDefault = 0;
  MATROSKA_ContextCueBlockNumber.DefaultValue = 0;
  MATROSKA_ContextCueBlockNumber.ElementName = "CueBlockNumber";
  MATROSKA_ContextCueBlockNumber.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueCodecState.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueCodecState.Id = 0xea;
  MATROSKA_ContextCueCodecState.Class = 0x54494245;
  MATROSKA_ContextCueCodecState.HasDefault = 1;
  MATROSKA_ContextCueCodecState.DefaultValue = 0;
  MATROSKA_ContextCueCodecState.ElementName = "CueCodecState";
  MATROSKA_ContextCueCodecState.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueRefTime.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueRefTime.Id = 0x96;
  MATROSKA_ContextCueRefTime.Class = 0x54494245;
  MATROSKA_ContextCueRefTime.HasDefault = 0;
  MATROSKA_ContextCueRefTime.DefaultValue = 0;
  MATROSKA_ContextCueRefTime.ElementName = "CueRefTime";
  MATROSKA_ContextCueRefTime.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueRefCluster.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueRefCluster.Id = 0x97;
  MATROSKA_ContextCueRefCluster.Class = 0x54494245;
  MATROSKA_ContextCueRefCluster.HasDefault = 0;
  MATROSKA_ContextCueRefCluster.DefaultValue = 0;
  MATROSKA_ContextCueRefCluster.ElementName = "CueRefCluster";
  MATROSKA_ContextCueRefCluster.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueRefNumber.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueRefNumber.Id = 0x535f;
  MATROSKA_ContextCueRefNumber.Class = 0x54494245;
  MATROSKA_ContextCueRefNumber.HasDefault = 1;
  MATROSKA_ContextCueRefNumber.DefaultValue = 1;
  MATROSKA_ContextCueRefNumber.ElementName = "CueRefNumber";
  MATROSKA_ContextCueRefNumber.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueRefCodecState.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueRefCodecState.Id = 0xeb;
  MATROSKA_ContextCueRefCodecState.Class = 0x54494245;
  MATROSKA_ContextCueRefCodecState.HasDefault = 1;
  MATROSKA_ContextCueRefCodecState.DefaultValue = 0;
  MATROSKA_ContextCueRefCodecState.ElementName = "CueRefCodecState";
  MATROSKA_ContextCueRefCodecState.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextCueReference.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueReference.Id = 0xdb;
  MATROSKA_ContextCueReference.Class = 0x544d4245;
  MATROSKA_ContextCueReference.HasDefault = 0;
  MATROSKA_ContextCueReference.DefaultValue = 0;
  MATROSKA_ContextCueReference.ElementName = "CueReference";
  MATROSKA_ContextCueReference.Semantic = EBML_SemanticCueReference;
  MATROSKA_ContextCueTrackPositions.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCueTrackPositions.Id = 0xb7;
  MATROSKA_ContextCueTrackPositions.Class = 0x544d4245;
  MATROSKA_ContextCueTrackPositions.HasDefault = 0;
  MATROSKA_ContextCueTrackPositions.DefaultValue = 0;
  MATROSKA_ContextCueTrackPositions.ElementName = "CueTrackPositions";
  MATROSKA_ContextCueTrackPositions.Semantic = EBML_SemanticCueTrackPositions;
  MATROSKA_ContextCuePoint.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCuePoint.Id = 0xbb;
  MATROSKA_ContextCuePoint.Class = 0x50434b4d;
  MATROSKA_ContextCuePoint.HasDefault = 0;
  MATROSKA_ContextCuePoint.DefaultValue = 0;
  MATROSKA_ContextCuePoint.ElementName = "CuePoint";
  MATROSKA_ContextCuePoint.Semantic = EBML_SemanticCuePoint;
  MATROSKA_ContextCues.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextCues.Id = 0x1c53bb6b;
  MATROSKA_ContextCues.Class = 0x544d4245;
  MATROSKA_ContextCues.HasDefault = 0;
  MATROSKA_ContextCues.DefaultValue = 0;
  MATROSKA_ContextCues.ElementName = "Cues";
  MATROSKA_ContextCues.Semantic = EBML_SemanticCues;
  MATROSKA_ContextFileDescription.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFileDescription.Id = 0x467e;
  MATROSKA_ContextFileDescription.Class = 0x55534245;
  MATROSKA_ContextFileDescription.HasDefault = 0;
  MATROSKA_ContextFileDescription.DefaultValue = 0;
  MATROSKA_ContextFileDescription.ElementName = "FileDescription";
  MATROSKA_ContextFileDescription.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFileName.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFileName.Id = 0x466e;
  MATROSKA_ContextFileName.Class = 0x55534245;
  MATROSKA_ContextFileName.HasDefault = 0;
  MATROSKA_ContextFileName.DefaultValue = 0;
  MATROSKA_ContextFileName.ElementName = "FileName";
  MATROSKA_ContextFileName.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFileMediaType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFileMediaType.Id = 0x4660;
  MATROSKA_ContextFileMediaType.Class = 0x47534245;
  MATROSKA_ContextFileMediaType.HasDefault = 0;
  MATROSKA_ContextFileMediaType.DefaultValue = 0;
  MATROSKA_ContextFileMediaType.ElementName = "FileMediaType";
  MATROSKA_ContextFileMediaType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFileData.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFileData.Id = 0x465c;
  MATROSKA_ContextFileData.Class = 0x42424b4d;
  MATROSKA_ContextFileData.HasDefault = 0;
  MATROSKA_ContextFileData.DefaultValue = 0;
  MATROSKA_ContextFileData.ElementName = "FileData";
  MATROSKA_ContextFileData.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFileUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFileUID.Id = 0x46ae;
  MATROSKA_ContextFileUID.Class = 0x54494245;
  MATROSKA_ContextFileUID.HasDefault = 0;
  MATROSKA_ContextFileUID.DefaultValue = 0;
  MATROSKA_ContextFileUID.ElementName = "FileUID";
  MATROSKA_ContextFileUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFileReferral.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFileReferral.Id = 0x4675;
  MATROSKA_ContextFileReferral.Class = 0x4e494245;
  MATROSKA_ContextFileReferral.HasDefault = 0;
  MATROSKA_ContextFileReferral.DefaultValue = 0;
  MATROSKA_ContextFileReferral.ElementName = "FileReferral";
  MATROSKA_ContextFileReferral.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFileUsedStartTime.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFileUsedStartTime.Id = 0x4661;
  MATROSKA_ContextFileUsedStartTime.Class = 0x54494245;
  MATROSKA_ContextFileUsedStartTime.HasDefault = 0;
  MATROSKA_ContextFileUsedStartTime.DefaultValue = 0;
  MATROSKA_ContextFileUsedStartTime.ElementName = "FileUsedStartTime";
  MATROSKA_ContextFileUsedStartTime.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextFileUsedEndTime.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextFileUsedEndTime.Id = 0x4662;
  MATROSKA_ContextFileUsedEndTime.Class = 0x54494245;
  MATROSKA_ContextFileUsedEndTime.HasDefault = 0;
  MATROSKA_ContextFileUsedEndTime.DefaultValue = 0;
  MATROSKA_ContextFileUsedEndTime.ElementName = "FileUsedEndTime";
  MATROSKA_ContextFileUsedEndTime.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextAttachedFile.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextAttachedFile.Id = 24999;
  MATROSKA_ContextAttachedFile.Class = 0x54414b4d;
  MATROSKA_ContextAttachedFile.HasDefault = 0;
  MATROSKA_ContextAttachedFile.DefaultValue = 0;
  MATROSKA_ContextAttachedFile.ElementName = "AttachedFile";
  MATROSKA_ContextAttachedFile.Semantic = EBML_SemanticAttachedFile;
  MATROSKA_ContextAttachments.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextAttachments.Id = 0x1941a469;
  MATROSKA_ContextAttachments.Class = 0x544d4245;
  MATROSKA_ContextAttachments.HasDefault = 0;
  MATROSKA_ContextAttachments.DefaultValue = 0;
  MATROSKA_ContextAttachments.ElementName = "Attachments";
  MATROSKA_ContextAttachments.Semantic = EBML_SemanticAttachments;
  MATROSKA_ContextEditionUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEditionUID.Id = 0x45bc;
  MATROSKA_ContextEditionUID.Class = 0x54494245;
  MATROSKA_ContextEditionUID.HasDefault = 0;
  MATROSKA_ContextEditionUID.DefaultValue = 0;
  MATROSKA_ContextEditionUID.ElementName = "EditionUID";
  MATROSKA_ContextEditionUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextEditionFlagHidden.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEditionFlagHidden.Id = 0x45bd;
  MATROSKA_ContextEditionFlagHidden.Class = 0x4f424245;
  MATROSKA_ContextEditionFlagHidden.HasDefault = 1;
  MATROSKA_ContextEditionFlagHidden.DefaultValue = 0;
  MATROSKA_ContextEditionFlagHidden.ElementName = "EditionFlagHidden";
  MATROSKA_ContextEditionFlagHidden.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextEditionFlagDefault.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEditionFlagDefault.Id = 0x45db;
  MATROSKA_ContextEditionFlagDefault.Class = 0x4f424245;
  MATROSKA_ContextEditionFlagDefault.HasDefault = 1;
  MATROSKA_ContextEditionFlagDefault.DefaultValue = 0;
  MATROSKA_ContextEditionFlagDefault.ElementName = "EditionFlagDefault";
  MATROSKA_ContextEditionFlagDefault.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextEditionFlagOrdered.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEditionFlagOrdered.Id = 0x45dd;
  MATROSKA_ContextEditionFlagOrdered.Class = 0x4f424245;
  MATROSKA_ContextEditionFlagOrdered.HasDefault = 1;
  MATROSKA_ContextEditionFlagOrdered.DefaultValue = 0;
  MATROSKA_ContextEditionFlagOrdered.ElementName = "EditionFlagOrdered";
  MATROSKA_ContextEditionFlagOrdered.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextEditionString.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEditionString.Id = 0x4521;
  MATROSKA_ContextEditionString.Class = 0x55534245;
  MATROSKA_ContextEditionString.HasDefault = 0;
  MATROSKA_ContextEditionString.DefaultValue = 0;
  MATROSKA_ContextEditionString.ElementName = "EditionString";
  MATROSKA_ContextEditionString.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextEditionLanguageIETF.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEditionLanguageIETF.Id = 0x45e4;
  MATROSKA_ContextEditionLanguageIETF.Class = 0x47534245;
  MATROSKA_ContextEditionLanguageIETF.HasDefault = 0;
  MATROSKA_ContextEditionLanguageIETF.DefaultValue = 0;
  MATROSKA_ContextEditionLanguageIETF.ElementName = "EditionLanguageIETF";
  MATROSKA_ContextEditionLanguageIETF.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextEditionDisplay.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEditionDisplay.Id = 0x4520;
  MATROSKA_ContextEditionDisplay.Class = 0x544d4245;
  MATROSKA_ContextEditionDisplay.HasDefault = 0;
  MATROSKA_ContextEditionDisplay.DefaultValue = 0;
  MATROSKA_ContextEditionDisplay.ElementName = "EditionDisplay";
  MATROSKA_ContextEditionDisplay.Semantic = EBML_SemanticEditionDisplay;
  MATROSKA_ContextChapterUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterUID.Id = 0x73c4;
  MATROSKA_ContextChapterUID.Class = 0x54494245;
  MATROSKA_ContextChapterUID.HasDefault = 0;
  MATROSKA_ContextChapterUID.DefaultValue = 0;
  MATROSKA_ContextChapterUID.ElementName = "ChapterUID";
  MATROSKA_ContextChapterUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterStringUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterStringUID.Id = 0x5654;
  MATROSKA_ContextChapterStringUID.Class = 0x55534245;
  MATROSKA_ContextChapterStringUID.HasDefault = 0;
  MATROSKA_ContextChapterStringUID.DefaultValue = 0;
  MATROSKA_ContextChapterStringUID.ElementName = "ChapterStringUID";
  MATROSKA_ContextChapterStringUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterTimeStart.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterTimeStart.Id = 0x91;
  MATROSKA_ContextChapterTimeStart.Class = 0x54494245;
  MATROSKA_ContextChapterTimeStart.HasDefault = 0;
  MATROSKA_ContextChapterTimeStart.DefaultValue = 0;
  MATROSKA_ContextChapterTimeStart.ElementName = "ChapterTimeStart";
  MATROSKA_ContextChapterTimeStart.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterTimeEnd.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterTimeEnd.Id = 0x92;
  MATROSKA_ContextChapterTimeEnd.Class = 0x54494245;
  MATROSKA_ContextChapterTimeEnd.HasDefault = 0;
  MATROSKA_ContextChapterTimeEnd.DefaultValue = 0;
  MATROSKA_ContextChapterTimeEnd.ElementName = "ChapterTimeEnd";
  MATROSKA_ContextChapterTimeEnd.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterFlagHidden.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterFlagHidden.Id = 0x98;
  MATROSKA_ContextChapterFlagHidden.Class = 0x4f424245;
  MATROSKA_ContextChapterFlagHidden.HasDefault = 1;
  MATROSKA_ContextChapterFlagHidden.DefaultValue = 0;
  MATROSKA_ContextChapterFlagHidden.ElementName = "ChapterFlagHidden";
  MATROSKA_ContextChapterFlagHidden.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterFlagEnabled.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterFlagEnabled.Id = 0x4598;
  MATROSKA_ContextChapterFlagEnabled.Class = 0x4f424245;
  MATROSKA_ContextChapterFlagEnabled.HasDefault = 1;
  MATROSKA_ContextChapterFlagEnabled.DefaultValue = 1;
  MATROSKA_ContextChapterFlagEnabled.ElementName = "ChapterFlagEnabled";
  MATROSKA_ContextChapterFlagEnabled.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterSegmentUUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterSegmentUUID.Id = 0x6e67;
  MATROSKA_ContextChapterSegmentUUID.Class = 0x44494b4d;
  MATROSKA_ContextChapterSegmentUUID.HasDefault = 0;
  MATROSKA_ContextChapterSegmentUUID.DefaultValue = 0;
  MATROSKA_ContextChapterSegmentUUID.ElementName = "ChapterSegmentUUID";
  MATROSKA_ContextChapterSegmentUUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterSkipType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterSkipType.Id = 0x4588;
  MATROSKA_ContextChapterSkipType.Class = 0x54494245;
  MATROSKA_ContextChapterSkipType.HasDefault = 0;
  MATROSKA_ContextChapterSkipType.DefaultValue = 0;
  MATROSKA_ContextChapterSkipType.ElementName = "ChapterSkipType";
  MATROSKA_ContextChapterSkipType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterSegmentEditionUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterSegmentEditionUID.Id = 0x6ebc;
  MATROSKA_ContextChapterSegmentEditionUID.Class = 0x54494245;
  MATROSKA_ContextChapterSegmentEditionUID.HasDefault = 0;
  MATROSKA_ContextChapterSegmentEditionUID.DefaultValue = 0;
  MATROSKA_ContextChapterSegmentEditionUID.ElementName = "ChapterSegmentEditionUID";
  MATROSKA_ContextChapterSegmentEditionUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterPhysicalEquiv.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterPhysicalEquiv.Id = 0x63c3;
  MATROSKA_ContextChapterPhysicalEquiv.Class = 0x54494245;
  MATROSKA_ContextChapterPhysicalEquiv.HasDefault = 0;
  MATROSKA_ContextChapterPhysicalEquiv.DefaultValue = 0;
  MATROSKA_ContextChapterPhysicalEquiv.ElementName = "ChapterPhysicalEquiv";
  MATROSKA_ContextChapterPhysicalEquiv.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterTrackNumber.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterTrackNumber.Id = 0x89;
  MATROSKA_ContextChapterTrackNumber.Class = 0x54494245;
  MATROSKA_ContextChapterTrackNumber.HasDefault = 0;
  MATROSKA_ContextChapterTrackNumber.DefaultValue = 0;
  MATROSKA_ContextChapterTrackNumber.ElementName = "ChapterTrackNumber";
  MATROSKA_ContextChapterTrackNumber.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterTrack.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterTrack.Id = 0x8f;
  MATROSKA_ContextChapterTrack.Class = 0x544d4245;
  MATROSKA_ContextChapterTrack.HasDefault = 0;
  MATROSKA_ContextChapterTrack.DefaultValue = 0;
  MATROSKA_ContextChapterTrack.ElementName = "ChapterTrack";
  MATROSKA_ContextChapterTrack.Semantic = EBML_SemanticChapterTrack;
  MATROSKA_ContextChapString.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapString.Id = 0x85;
  MATROSKA_ContextChapString.Class = 0x55534245;
  MATROSKA_ContextChapString.HasDefault = 0;
  MATROSKA_ContextChapString.DefaultValue = 0;
  MATROSKA_ContextChapString.ElementName = "ChapString";
  MATROSKA_ContextChapString.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapLanguage.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapLanguage.Id = 0x437c;
  MATROSKA_ContextChapLanguage.Class = 0x47534245;
  MATROSKA_ContextChapLanguage.HasDefault = 1;
  MATROSKA_ContextChapLanguage.DefaultValue = (intptr_t)anon_var_dwarf_117cc;
  MATROSKA_ContextChapLanguage.ElementName = "ChapLanguage";
  MATROSKA_ContextChapLanguage.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapLanguageBCP47.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapLanguageBCP47.Id = 0x437d;
  MATROSKA_ContextChapLanguageBCP47.Class = 0x47534245;
  MATROSKA_ContextChapLanguageBCP47.HasDefault = 0;
  MATROSKA_ContextChapLanguageBCP47.DefaultValue = 0;
  MATROSKA_ContextChapLanguageBCP47.ElementName = "ChapLanguageBCP47";
  MATROSKA_ContextChapLanguageBCP47.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapCountry.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapCountry.Id = 0x437e;
  MATROSKA_ContextChapCountry.Class = 0x47534245;
  MATROSKA_ContextChapCountry.HasDefault = 0;
  MATROSKA_ContextChapCountry.DefaultValue = 0;
  MATROSKA_ContextChapCountry.ElementName = "ChapCountry";
  MATROSKA_ContextChapCountry.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapterDisplay.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterDisplay.Id = 0x80;
  MATROSKA_ContextChapterDisplay.Class = 0x544d4245;
  MATROSKA_ContextChapterDisplay.HasDefault = 0;
  MATROSKA_ContextChapterDisplay.DefaultValue = 0;
  MATROSKA_ContextChapterDisplay.ElementName = "ChapterDisplay";
  MATROSKA_ContextChapterDisplay.Semantic = EBML_SemanticChapterDisplay;
  MATROSKA_ContextChapProcessCodecID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapProcessCodecID.Id = 0x6955;
  MATROSKA_ContextChapProcessCodecID.Class = 0x54494245;
  MATROSKA_ContextChapProcessCodecID.HasDefault = 1;
  MATROSKA_ContextChapProcessCodecID.DefaultValue = 0;
  MATROSKA_ContextChapProcessCodecID.ElementName = "ChapProcessCodecID";
  MATROSKA_ContextChapProcessCodecID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapProcessPrivate.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapProcessPrivate.Id = 0x450d;
  MATROSKA_ContextChapProcessPrivate.Class = 0x4e494245;
  MATROSKA_ContextChapProcessPrivate.HasDefault = 0;
  MATROSKA_ContextChapProcessPrivate.DefaultValue = 0;
  MATROSKA_ContextChapProcessPrivate.ElementName = "ChapProcessPrivate";
  MATROSKA_ContextChapProcessPrivate.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapProcessTime.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapProcessTime.Id = 0x6922;
  MATROSKA_ContextChapProcessTime.Class = 0x54494245;
  MATROSKA_ContextChapProcessTime.HasDefault = 0;
  MATROSKA_ContextChapProcessTime.DefaultValue = 0;
  MATROSKA_ContextChapProcessTime.ElementName = "ChapProcessTime";
  MATROSKA_ContextChapProcessTime.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapProcessData.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapProcessData.Id = 0x6933;
  MATROSKA_ContextChapProcessData.Class = 0x4e494245;
  MATROSKA_ContextChapProcessData.HasDefault = 0;
  MATROSKA_ContextChapProcessData.DefaultValue = 0;
  MATROSKA_ContextChapProcessData.ElementName = "ChapProcessData";
  MATROSKA_ContextChapProcessData.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextChapProcessCommand.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapProcessCommand.Id = 0x6911;
  MATROSKA_ContextChapProcessCommand.Class = 0x544d4245;
  MATROSKA_ContextChapProcessCommand.HasDefault = 0;
  MATROSKA_ContextChapProcessCommand.DefaultValue = 0;
  MATROSKA_ContextChapProcessCommand.ElementName = "ChapProcessCommand";
  MATROSKA_ContextChapProcessCommand.Semantic = EBML_SemanticChapProcessCommand;
  MATROSKA_ContextChapProcess.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapProcess.Id = 0x6944;
  MATROSKA_ContextChapProcess.Class = 0x544d4245;
  MATROSKA_ContextChapProcess.HasDefault = 0;
  MATROSKA_ContextChapProcess.DefaultValue = 0;
  MATROSKA_ContextChapProcess.ElementName = "ChapProcess";
  MATROSKA_ContextChapProcess.Semantic = EBML_SemanticChapProcess;
  MATROSKA_ContextChapterAtom.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapterAtom.Id = 0xb6;
  MATROSKA_ContextChapterAtom.Class = 0x544d4245;
  MATROSKA_ContextChapterAtom.HasDefault = 0;
  MATROSKA_ContextChapterAtom.DefaultValue = 0;
  MATROSKA_ContextChapterAtom.ElementName = "ChapterAtom";
  MATROSKA_ContextChapterAtom.Semantic = EBML_SemanticChapterAtom;
  MATROSKA_ContextEditionEntry.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextEditionEntry.Id = 0x45b9;
  MATROSKA_ContextEditionEntry.Class = 0x544d4245;
  MATROSKA_ContextEditionEntry.HasDefault = 0;
  MATROSKA_ContextEditionEntry.DefaultValue = 0;
  MATROSKA_ContextEditionEntry.ElementName = "EditionEntry";
  MATROSKA_ContextEditionEntry.Semantic = EBML_SemanticEditionEntry;
  MATROSKA_ContextChapters.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextChapters.Id = 0x1043a770;
  MATROSKA_ContextChapters.Class = 0x544d4245;
  MATROSKA_ContextChapters.HasDefault = 0;
  MATROSKA_ContextChapters.DefaultValue = 0;
  MATROSKA_ContextChapters.ElementName = "Chapters";
  MATROSKA_ContextChapters.Semantic = EBML_SemanticChapters;
  MATROSKA_ContextTargetTypeValue.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTargetTypeValue.Id = 0x68ca;
  MATROSKA_ContextTargetTypeValue.Class = 0x54494245;
  MATROSKA_ContextTargetTypeValue.HasDefault = 1;
  MATROSKA_ContextTargetTypeValue.DefaultValue = 0x32;
  MATROSKA_ContextTargetTypeValue.ElementName = "TargetTypeValue";
  MATROSKA_ContextTargetTypeValue.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTargetType.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTargetType.Id = 0x63ca;
  MATROSKA_ContextTargetType.Class = 0x47534245;
  MATROSKA_ContextTargetType.HasDefault = 0;
  MATROSKA_ContextTargetType.DefaultValue = 0;
  MATROSKA_ContextTargetType.ElementName = "TargetType";
  MATROSKA_ContextTargetType.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagTrackUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagTrackUID.Id = 0x63c5;
  MATROSKA_ContextTagTrackUID.Class = 0x54494245;
  MATROSKA_ContextTagTrackUID.HasDefault = 1;
  MATROSKA_ContextTagTrackUID.DefaultValue = 0;
  MATROSKA_ContextTagTrackUID.ElementName = "TagTrackUID";
  MATROSKA_ContextTagTrackUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagEditionUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagEditionUID.Id = 0x63c9;
  MATROSKA_ContextTagEditionUID.Class = 0x54494245;
  MATROSKA_ContextTagEditionUID.HasDefault = 1;
  MATROSKA_ContextTagEditionUID.DefaultValue = 0;
  MATROSKA_ContextTagEditionUID.ElementName = "TagEditionUID";
  MATROSKA_ContextTagEditionUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagChapterUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagChapterUID.Id = 0x63c4;
  MATROSKA_ContextTagChapterUID.Class = 0x54494245;
  MATROSKA_ContextTagChapterUID.HasDefault = 1;
  MATROSKA_ContextTagChapterUID.DefaultValue = 0;
  MATROSKA_ContextTagChapterUID.ElementName = "TagChapterUID";
  MATROSKA_ContextTagChapterUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagAttachmentUID.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagAttachmentUID.Id = 0x63c6;
  MATROSKA_ContextTagAttachmentUID.Class = 0x54494245;
  MATROSKA_ContextTagAttachmentUID.HasDefault = 1;
  MATROSKA_ContextTagAttachmentUID.DefaultValue = 0;
  MATROSKA_ContextTagAttachmentUID.ElementName = "TagAttachmentUID";
  MATROSKA_ContextTagAttachmentUID.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTargets.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTargets.Id = 0x63c0;
  MATROSKA_ContextTargets.Class = 0x544d4245;
  MATROSKA_ContextTargets.HasDefault = 0;
  MATROSKA_ContextTargets.DefaultValue = 0;
  MATROSKA_ContextTargets.ElementName = "Targets";
  MATROSKA_ContextTargets.Semantic = EBML_SemanticTargets;
  MATROSKA_ContextTagName.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagName.Id = 0x45a3;
  MATROSKA_ContextTagName.Class = 0x55534245;
  MATROSKA_ContextTagName.HasDefault = 0;
  MATROSKA_ContextTagName.DefaultValue = 0;
  MATROSKA_ContextTagName.ElementName = "TagName";
  MATROSKA_ContextTagName.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagLanguage.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagLanguage.Id = 0x447a;
  MATROSKA_ContextTagLanguage.Class = 0x47534245;
  MATROSKA_ContextTagLanguage.HasDefault = 1;
  MATROSKA_ContextTagLanguage.DefaultValue = (intptr_t)anon_var_dwarf_11fff;
  MATROSKA_ContextTagLanguage.ElementName = "TagLanguage";
  MATROSKA_ContextTagLanguage.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagLanguageBCP47.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagLanguageBCP47.Id = 0x447b;
  MATROSKA_ContextTagLanguageBCP47.Class = 0x47534245;
  MATROSKA_ContextTagLanguageBCP47.HasDefault = 0;
  MATROSKA_ContextTagLanguageBCP47.DefaultValue = 0;
  MATROSKA_ContextTagLanguageBCP47.ElementName = "TagLanguageBCP47";
  MATROSKA_ContextTagLanguageBCP47.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagDefault.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagDefault.Id = 0x4484;
  MATROSKA_ContextTagDefault.Class = 0x4f424245;
  MATROSKA_ContextTagDefault.HasDefault = 1;
  MATROSKA_ContextTagDefault.DefaultValue = 1;
  MATROSKA_ContextTagDefault.ElementName = "TagDefault";
  MATROSKA_ContextTagDefault.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagDefaultBogus.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagDefaultBogus.Id = 0x44b4;
  MATROSKA_ContextTagDefaultBogus.Class = 0x4f424245;
  MATROSKA_ContextTagDefaultBogus.HasDefault = 1;
  MATROSKA_ContextTagDefaultBogus.DefaultValue = 1;
  MATROSKA_ContextTagDefaultBogus.ElementName = "TagDefaultBogus";
  MATROSKA_ContextTagDefaultBogus.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagString.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagString.Id = 0x4487;
  MATROSKA_ContextTagString.Class = 0x55534245;
  MATROSKA_ContextTagString.HasDefault = 0;
  MATROSKA_ContextTagString.DefaultValue = 0;
  MATROSKA_ContextTagString.ElementName = "TagString";
  MATROSKA_ContextTagString.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextTagBinary.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTagBinary.Id = 0x4485;
  MATROSKA_ContextTagBinary.Class = 0x4e494245;
  MATROSKA_ContextTagBinary.HasDefault = 0;
  MATROSKA_ContextTagBinary.DefaultValue = 0;
  MATROSKA_ContextTagBinary.ElementName = "TagBinary";
  MATROSKA_ContextTagBinary.Semantic = (ebml_semantic *)0x0;
  MATROSKA_ContextSimpleTag.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSimpleTag.Id = 0x67c8;
  MATROSKA_ContextSimpleTag.Class = 0x544d4245;
  MATROSKA_ContextSimpleTag.HasDefault = 0;
  MATROSKA_ContextSimpleTag.DefaultValue = 0;
  MATROSKA_ContextSimpleTag.ElementName = "SimpleTag";
  MATROSKA_ContextSimpleTag.Semantic = EBML_SemanticSimpleTag;
  MATROSKA_ContextTag.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTag.Id = 0x7373;
  MATROSKA_ContextTag.Class = 0x544d4245;
  MATROSKA_ContextTag.HasDefault = 0;
  MATROSKA_ContextTag.DefaultValue = 0;
  MATROSKA_ContextTag.ElementName = "Tag";
  MATROSKA_ContextTag.Semantic = EBML_SemanticTag;
  MATROSKA_ContextTags.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextTags.Id = 0x1254c367;
  MATROSKA_ContextTags.Class = 0x544d4245;
  MATROSKA_ContextTags.HasDefault = 0;
  MATROSKA_ContextTags.DefaultValue = 0;
  MATROSKA_ContextTags.ElementName = "Tags";
  MATROSKA_ContextTags.Semantic = EBML_SemanticTags;
  MATROSKA_ContextSegment.GlobalContext = EBML_getSemanticGlobals();
  MATROSKA_ContextSegment.Id = 0x18538067;
  MATROSKA_ContextSegment.Class = 0x544d4245;
  MATROSKA_ContextSegment.HasDefault = 0;
  MATROSKA_ContextSegment.DefaultValue = 0;
  MATROSKA_ContextSegment.ElementName = "Segment";
  MATROSKA_ContextSegment.Semantic = EBML_SemanticSegment;
  return;
}

Assistant:

void MATROSKA_InitSemantic(void)
{
    MATROSKA_ContextSeekID = (ebml_context) {0x53AB, EBML_BINARY_CLASS, 0, 0, "SeekID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSeekPosition = (ebml_context) {0x53AC, EBML_INTEGER_CLASS, 0, 0, "SeekPosition", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSeek = (ebml_context) {0x4DBB, MATROSKA_SEEKPOINT_CLASS, 0, 0, "Seek", EBML_SemanticSeek, EBML_getSemanticGlobals()};
    MATROSKA_ContextSeekHead = (ebml_context) {0x114D9B74, EBML_MASTER_CLASS, 0, 0, "SeekHead", EBML_SemanticSeekHead, EBML_getSemanticGlobals()};
    MATROSKA_ContextSegmentUUID = (ebml_context) {0x73A4, MATROSKA_SEGMENTUID_CLASS, 0, 0, "SegmentUUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSegmentFilename = (ebml_context) {0x7384, EBML_UNISTRING_CLASS, 0, 0, "SegmentFilename", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrevUUID = (ebml_context) {0x3CB923, MATROSKA_SEGMENTUID_CLASS, 0, 0, "PrevUUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrevFilename = (ebml_context) {0x3C83AB, EBML_UNISTRING_CLASS, 0, 0, "PrevFilename", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextNextUUID = (ebml_context) {0x3EB923, MATROSKA_SEGMENTUID_CLASS, 0, 0, "NextUUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextNextFilename = (ebml_context) {0x3E83BB, EBML_UNISTRING_CLASS, 0, 0, "NextFilename", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSegmentFamily = (ebml_context) {0x4444, MATROSKA_SEGMENTUID_CLASS, 0, 0, "SegmentFamily", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTranslateID = (ebml_context) {0x69A5, EBML_BINARY_CLASS, 0, 0, "ChapterTranslateID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTranslateCodec = (ebml_context) {0x69BF, EBML_INTEGER_CLASS, 0, 0, "ChapterTranslateCodec", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTranslateEditionUID = (ebml_context) {0x69FC, EBML_INTEGER_CLASS, 0, 0, "ChapterTranslateEditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTranslate = (ebml_context) {0x6924, EBML_MASTER_CLASS, 0, 0, "ChapterTranslate", EBML_SemanticChapterTranslate, EBML_getSemanticGlobals()};
    MATROSKA_ContextTimestampScale = (ebml_context) {0x2AD7B1, EBML_INTEGER_CLASS, 1, 1000000, "TimestampScale", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDuration = (ebml_context) {0x4489, EBML_FLOAT_CLASS, 0, 0, "Duration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDateUTC = (ebml_context) {0x4461, EBML_DATE_CLASS, 0, 0, "DateUTC", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTitle = (ebml_context) {0x7BA9, EBML_UNISTRING_CLASS, 0, 0, "Title", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMuxingApp = (ebml_context) {0x4D80, EBML_UNISTRING_CLASS, 0, 0, "MuxingApp", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextWritingApp = (ebml_context) {0x5741, EBML_UNISTRING_CLASS, 0, 0, "WritingApp", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextInfo = (ebml_context) {0x1549A966, EBML_MASTER_CLASS, 0, 0, "Info", EBML_SemanticInfo, EBML_getSemanticGlobals()};
    MATROSKA_ContextTimestamp = (ebml_context) {0xE7, EBML_INTEGER_CLASS, 0, 0, "Timestamp", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSilentTrackNumber = (ebml_context) {0x58D7, EBML_INTEGER_CLASS, 0, 0, "SilentTrackNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSilentTracks = (ebml_context) {0x5854, EBML_MASTER_CLASS, 0, 0, "SilentTracks", EBML_SemanticSilentTracks, EBML_getSemanticGlobals()};
    MATROSKA_ContextPosition = (ebml_context) {0xA7, EBML_INTEGER_CLASS, 0, 0, "Position", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrevSize = (ebml_context) {0xAB, EBML_INTEGER_CLASS, 0, 0, "PrevSize", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSimpleBlock = (ebml_context) {0xA3, MATROSKA_BLOCK_CLASS, 0, 0, "SimpleBlock", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlock = (ebml_context) {0xA1, MATROSKA_BLOCK_CLASS, 0, 0, "Block", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockVirtual = (ebml_context) {0xA2, EBML_BINARY_CLASS, 0, 0, "BlockVirtual", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAdditional = (ebml_context) {0xA5, EBML_BINARY_CLASS, 0, 0, "BlockAdditional", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddID = (ebml_context) {0xEE, EBML_INTEGER_CLASS, 1, 1, "BlockAddID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockMore = (ebml_context) {0xA6, EBML_MASTER_CLASS, 0, 0, "BlockMore", EBML_SemanticBlockMore, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAdditions = (ebml_context) {0x75A1, EBML_MASTER_CLASS, 0, 0, "BlockAdditions", EBML_SemanticBlockAdditions, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockDuration = (ebml_context) {0x9B, EBML_INTEGER_CLASS, 0, 0, "BlockDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferencePriority = (ebml_context) {0xFA, EBML_INTEGER_CLASS, 1, 0, "ReferencePriority", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceBlock = (ebml_context) {0xFB, EBML_SINTEGER_CLASS, 0, 0, "ReferenceBlock", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceVirtual = (ebml_context) {0xFD, EBML_SINTEGER_CLASS, 0, 0, "ReferenceVirtual", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecState = (ebml_context) {0xA4, EBML_BINARY_CLASS, 0, 0, "CodecState", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDiscardPadding = (ebml_context) {0x75A2, EBML_SINTEGER_CLASS, 0, 0, "DiscardPadding", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLaceNumber = (ebml_context) {0xCC, EBML_INTEGER_CLASS, 0, 0, "LaceNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFrameNumber = (ebml_context) {0xCD, EBML_INTEGER_CLASS, 1, 0, "FrameNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAdditionID = (ebml_context) {0xCB, EBML_INTEGER_CLASS, 1, 0, "BlockAdditionID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDelay = (ebml_context) {0xCE, EBML_INTEGER_CLASS, 1, 0, "Delay", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSliceDuration = (ebml_context) {0xCF, EBML_INTEGER_CLASS, 1, 0, "SliceDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTimeSlice = (ebml_context) {0xE8, EBML_MASTER_CLASS, 0, 0, "TimeSlice", EBML_SemanticTimeSlice, EBML_getSemanticGlobals()};
    MATROSKA_ContextSlices = (ebml_context) {0x8E, EBML_MASTER_CLASS, 0, 0, "Slices", EBML_SemanticSlices, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceOffset = (ebml_context) {0xC9, EBML_INTEGER_CLASS, 0, 0, "ReferenceOffset", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceTimestamp = (ebml_context) {0xCA, EBML_INTEGER_CLASS, 0, 0, "ReferenceTimestamp", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextReferenceFrame = (ebml_context) {0xC8, EBML_MASTER_CLASS, 0, 0, "ReferenceFrame", EBML_SemanticReferenceFrame, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockGroup = (ebml_context) {0xA0, MATROSKA_BLOCKGROUP_CLASS, 0, 0, "BlockGroup", EBML_SemanticBlockGroup, EBML_getSemanticGlobals()};
    MATROSKA_ContextEncryptedBlock = (ebml_context) {0xAF, EBML_BINARY_CLASS, 0, 0, "EncryptedBlock", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCluster = (ebml_context) {0x1F43B675, MATROSKA_CLUSTER_CLASS, 0, 0, "Cluster", EBML_SemanticCluster, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackNumber = (ebml_context) {0xD7, EBML_INTEGER_CLASS, 0, 0, "TrackNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackUID = (ebml_context) {0x73C5, EBML_INTEGER_CLASS, 0, 0, "TrackUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackType = (ebml_context) {0x83, EBML_INTEGER_CLASS, 0, 0, "TrackType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagEnabled = (ebml_context) {0xB9, EBML_BOOLEAN_CLASS, 1, 1, "FlagEnabled", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagDefault = (ebml_context) {0x88, EBML_BOOLEAN_CLASS, 1, 1, "FlagDefault", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagForced = (ebml_context) {0x55AA, EBML_BOOLEAN_CLASS, 1, 0, "FlagForced", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagHearingImpaired = (ebml_context) {0x55AB, EBML_BOOLEAN_CLASS, 0, 0, "FlagHearingImpaired", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagVisualImpaired = (ebml_context) {0x55AC, EBML_BOOLEAN_CLASS, 0, 0, "FlagVisualImpaired", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagTextDescriptions = (ebml_context) {0x55AD, EBML_BOOLEAN_CLASS, 0, 0, "FlagTextDescriptions", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagOriginal = (ebml_context) {0x55AE, EBML_BOOLEAN_CLASS, 0, 0, "FlagOriginal", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagCommentary = (ebml_context) {0x55AF, EBML_BOOLEAN_CLASS, 0, 0, "FlagCommentary", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagLacing = (ebml_context) {0x9C, EBML_BOOLEAN_CLASS, 1, 1, "FlagLacing", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMinCache = (ebml_context) {0x6DE7, EBML_INTEGER_CLASS, 1, 0, "MinCache", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMaxCache = (ebml_context) {0x6DF8, EBML_INTEGER_CLASS, 0, 0, "MaxCache", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDefaultDuration = (ebml_context) {0x23E383, EBML_INTEGER_CLASS, 0, 0, "DefaultDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDefaultDecodedFieldDuration = (ebml_context) {0x234E7A, EBML_INTEGER_CLASS, 0, 0, "DefaultDecodedFieldDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTimestampScale = (ebml_context) {0x23314F, EBML_FLOAT_CLASS, 1, 1, "TrackTimestampScale", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackOffset = (ebml_context) {0x537F, EBML_SINTEGER_CLASS, 1, 0, "TrackOffset", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMaxBlockAdditionID = (ebml_context) {0x55EE, EBML_INTEGER_CLASS, 1, 0, "MaxBlockAdditionID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddIDValue = (ebml_context) {0x41F0, EBML_INTEGER_CLASS, 0, 0, "BlockAddIDValue", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddIDName = (ebml_context) {0x41A4, EBML_STRING_CLASS, 0, 0, "BlockAddIDName", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddIDType = (ebml_context) {0x41E7, EBML_INTEGER_CLASS, 1, 0, "BlockAddIDType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAddIDExtraData = (ebml_context) {0x41ED, EBML_BINARY_CLASS, 0, 0, "BlockAddIDExtraData", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBlockAdditionMapping = (ebml_context) {0x41E4, EBML_MASTER_CLASS, 0, 0, "BlockAdditionMapping", EBML_SemanticBlockAdditionMapping, EBML_getSemanticGlobals()};
    MATROSKA_ContextName = (ebml_context) {0x536E, EBML_UNISTRING_CLASS, 0, 0, "Name", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLanguage = (ebml_context) {0x22B59C, EBML_STRING_CLASS, 1, (intptr_t)"eng", "Language", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLanguageBCP47 = (ebml_context) {0x22B59D, EBML_STRING_CLASS, 0, 0, "LanguageBCP47", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecID = (ebml_context) {0x86, EBML_STRING_CLASS, 0, 0, "CodecID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecPrivate = (ebml_context) {0x63A2, EBML_BINARY_CLASS, 0, 0, "CodecPrivate", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecName = (ebml_context) {0x258688, EBML_UNISTRING_CLASS, 0, 0, "CodecName", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAttachmentLink = (ebml_context) {0x7446, EBML_INTEGER_CLASS, 0, 0, "AttachmentLink", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecSettings = (ebml_context) {0x3A9697, EBML_UNISTRING_CLASS, 0, 0, "CodecSettings", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecInfoURL = (ebml_context) {0x3B4040, EBML_STRING_CLASS, 0, 0, "CodecInfoURL", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecDownloadURL = (ebml_context) {0x26B240, EBML_STRING_CLASS, 0, 0, "CodecDownloadURL", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecDecodeAll = (ebml_context) {0xAA, EBML_BOOLEAN_CLASS, 1, 1, "CodecDecodeAll", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackOverlay = (ebml_context) {0x6FAB, EBML_INTEGER_CLASS, 0, 0, "TrackOverlay", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCodecDelay = (ebml_context) {0x56AA, EBML_INTEGER_CLASS, 1, 0, "CodecDelay", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSeekPreRoll = (ebml_context) {0x56BB, EBML_INTEGER_CLASS, 1, 0, "SeekPreRoll", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTranslateTrackID = (ebml_context) {0x66A5, EBML_BINARY_CLASS, 0, 0, "TrackTranslateTrackID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTranslateCodec = (ebml_context) {0x66BF, EBML_INTEGER_CLASS, 0, 0, "TrackTranslateCodec", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTranslateEditionUID = (ebml_context) {0x66FC, EBML_INTEGER_CLASS, 0, 0, "TrackTranslateEditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackTranslate = (ebml_context) {0x6624, EBML_MASTER_CLASS, 0, 0, "TrackTranslate", EBML_SemanticTrackTranslate, EBML_getSemanticGlobals()};
    MATROSKA_ContextFlagInterlaced = (ebml_context) {0x9A, EBML_INTEGER_CLASS, 1, 0, "FlagInterlaced", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFieldOrder = (ebml_context) {0x9D, EBML_INTEGER_CLASS, 1, 2, "FieldOrder", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextStereoMode = (ebml_context) {0x53B8, EBML_INTEGER_CLASS, 1, 0, "StereoMode", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAlphaMode = (ebml_context) {0x53C0, EBML_INTEGER_CLASS, 1, 0, "AlphaMode", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextOldStereoMode = (ebml_context) {0x53B9, EBML_INTEGER_CLASS, 0, 0, "OldStereoMode", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelWidth = (ebml_context) {0xB0, EBML_INTEGER_CLASS, 0, 0, "PixelWidth", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelHeight = (ebml_context) {0xBA, EBML_INTEGER_CLASS, 0, 0, "PixelHeight", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelCropBottom = (ebml_context) {0x54AA, EBML_INTEGER_CLASS, 1, 0, "PixelCropBottom", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelCropTop = (ebml_context) {0x54BB, EBML_INTEGER_CLASS, 1, 0, "PixelCropTop", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelCropLeft = (ebml_context) {0x54CC, EBML_INTEGER_CLASS, 1, 0, "PixelCropLeft", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPixelCropRight = (ebml_context) {0x54DD, EBML_INTEGER_CLASS, 1, 0, "PixelCropRight", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDisplayWidth = (ebml_context) {0x54B0, EBML_INTEGER_CLASS, 0, 0, "DisplayWidth", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDisplayHeight = (ebml_context) {0x54BA, EBML_INTEGER_CLASS, 0, 0, "DisplayHeight", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextDisplayUnit = (ebml_context) {0x54B2, EBML_INTEGER_CLASS, 1, 0, "DisplayUnit", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAspectRatioType = (ebml_context) {0x54B3, EBML_INTEGER_CLASS, 1, 0, "AspectRatioType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextUncompressedFourCC = (ebml_context) {0x2EB524, EBML_BINARY_CLASS, 0, 0, "UncompressedFourCC", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextGammaValue = (ebml_context) {0x2FB523, EBML_FLOAT_CLASS, 0, 0, "GammaValue", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFrameRate = (ebml_context) {0x2383E3, EBML_FLOAT_CLASS, 0, 0, "FrameRate", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMatrixCoefficients = (ebml_context) {0x55B1, EBML_INTEGER_CLASS, 1, 2, "MatrixCoefficients", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBitsPerChannel = (ebml_context) {0x55B2, EBML_INTEGER_CLASS, 1, 0, "BitsPerChannel", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChromaSubsamplingHorz = (ebml_context) {0x55B3, EBML_INTEGER_CLASS, 0, 0, "ChromaSubsamplingHorz", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChromaSubsamplingVert = (ebml_context) {0x55B4, EBML_INTEGER_CLASS, 0, 0, "ChromaSubsamplingVert", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCbSubsamplingHorz = (ebml_context) {0x55B5, EBML_INTEGER_CLASS, 0, 0, "CbSubsamplingHorz", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCbSubsamplingVert = (ebml_context) {0x55B6, EBML_INTEGER_CLASS, 0, 0, "CbSubsamplingVert", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChromaSitingHorz = (ebml_context) {0x55B7, EBML_INTEGER_CLASS, 1, 0, "ChromaSitingHorz", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChromaSitingVert = (ebml_context) {0x55B8, EBML_INTEGER_CLASS, 1, 0, "ChromaSitingVert", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextRange = (ebml_context) {0x55B9, EBML_INTEGER_CLASS, 1, 0, "Range", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTransferCharacteristics = (ebml_context) {0x55BA, EBML_INTEGER_CLASS, 1, 2, "TransferCharacteristics", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaries = (ebml_context) {0x55BB, EBML_INTEGER_CLASS, 1, 2, "Primaries", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMaxCLL = (ebml_context) {0x55BC, EBML_INTEGER_CLASS, 0, 0, "MaxCLL", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMaxFALL = (ebml_context) {0x55BD, EBML_INTEGER_CLASS, 0, 0, "MaxFALL", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryRChromaticityX = (ebml_context) {0x55D1, EBML_FLOAT_CLASS, 0, 0, "PrimaryRChromaticityX", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryRChromaticityY = (ebml_context) {0x55D2, EBML_FLOAT_CLASS, 0, 0, "PrimaryRChromaticityY", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryGChromaticityX = (ebml_context) {0x55D3, EBML_FLOAT_CLASS, 0, 0, "PrimaryGChromaticityX", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryGChromaticityY = (ebml_context) {0x55D4, EBML_FLOAT_CLASS, 0, 0, "PrimaryGChromaticityY", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryBChromaticityX = (ebml_context) {0x55D5, EBML_FLOAT_CLASS, 0, 0, "PrimaryBChromaticityX", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextPrimaryBChromaticityY = (ebml_context) {0x55D6, EBML_FLOAT_CLASS, 0, 0, "PrimaryBChromaticityY", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextWhitePointChromaticityX = (ebml_context) {0x55D7, EBML_FLOAT_CLASS, 0, 0, "WhitePointChromaticityX", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextWhitePointChromaticityY = (ebml_context) {0x55D8, EBML_FLOAT_CLASS, 0, 0, "WhitePointChromaticityY", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLuminanceMax = (ebml_context) {0x55D9, EBML_FLOAT_CLASS, 0, 0, "LuminanceMax", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextLuminanceMin = (ebml_context) {0x55DA, EBML_FLOAT_CLASS, 0, 0, "LuminanceMin", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextMasteringMetadata = (ebml_context) {0x55D0, EBML_MASTER_CLASS, 0, 0, "MasteringMetadata", EBML_SemanticMasteringMetadata, EBML_getSemanticGlobals()};
    MATROSKA_ContextColour = (ebml_context) {0x55B0, EBML_MASTER_CLASS, 0, 0, "Colour", EBML_SemanticColour, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionType = (ebml_context) {0x7671, EBML_INTEGER_CLASS, 1, 0, "ProjectionType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionPrivate = (ebml_context) {0x7672, EBML_BINARY_CLASS, 0, 0, "ProjectionPrivate", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionPoseYaw = (ebml_context) {0x7673, EBML_FLOAT_CLASS, 1, 0, "ProjectionPoseYaw", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionPosePitch = (ebml_context) {0x7674, EBML_FLOAT_CLASS, 1, 0, "ProjectionPosePitch", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjectionPoseRoll = (ebml_context) {0x7675, EBML_FLOAT_CLASS, 1, 0, "ProjectionPoseRoll", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextProjection = (ebml_context) {0x7670, EBML_MASTER_CLASS, 0, 0, "Projection", EBML_SemanticProjection, EBML_getSemanticGlobals()};
    MATROSKA_ContextVideo = (ebml_context) {0xE0, EBML_MASTER_CLASS, 0, 0, "Video", EBML_SemanticVideo, EBML_getSemanticGlobals()};
    MATROSKA_ContextSamplingFrequency = (ebml_context) {0xB5, EBML_FLOAT_CLASS, 1, 8000, "SamplingFrequency", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextOutputSamplingFrequency = (ebml_context) {0x78B5, EBML_FLOAT_CLASS, 0, 0, "OutputSamplingFrequency", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChannels = (ebml_context) {0x9F, EBML_INTEGER_CLASS, 1, 1, "Channels", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChannelPositions = (ebml_context) {0x7D7B, EBML_BINARY_CLASS, 0, 0, "ChannelPositions", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextBitDepth = (ebml_context) {0x6264, EBML_INTEGER_CLASS, 0, 0, "BitDepth", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEmphasis = (ebml_context) {0x52F1, EBML_INTEGER_CLASS, 1, 0, "Emphasis", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAudio = (ebml_context) {0xE1, EBML_MASTER_CLASS, 0, 0, "Audio", EBML_SemanticAudio, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackPlaneUID = (ebml_context) {0xE5, EBML_INTEGER_CLASS, 0, 0, "TrackPlaneUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackPlaneType = (ebml_context) {0xE6, EBML_INTEGER_CLASS, 0, 0, "TrackPlaneType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackPlane = (ebml_context) {0xE4, EBML_MASTER_CLASS, 0, 0, "TrackPlane", EBML_SemanticTrackPlane, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackCombinePlanes = (ebml_context) {0xE3, EBML_MASTER_CLASS, 0, 0, "TrackCombinePlanes", EBML_SemanticTrackCombinePlanes, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackJoinUID = (ebml_context) {0xED, EBML_INTEGER_CLASS, 0, 0, "TrackJoinUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackJoinBlocks = (ebml_context) {0xE9, EBML_MASTER_CLASS, 0, 0, "TrackJoinBlocks", EBML_SemanticTrackJoinBlocks, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackOperation = (ebml_context) {0xE2, EBML_MASTER_CLASS, 0, 0, "TrackOperation", EBML_SemanticTrackOperation, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickTrackUID = (ebml_context) {0xC0, EBML_INTEGER_CLASS, 0, 0, "TrickTrackUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickTrackSegmentUID = (ebml_context) {0xC1, MATROSKA_SEGMENTUID_CLASS, 0, 0, "TrickTrackSegmentUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickTrackFlag = (ebml_context) {0xC6, EBML_INTEGER_CLASS, 1, 0, "TrickTrackFlag", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickMasterTrackUID = (ebml_context) {0xC7, EBML_INTEGER_CLASS, 0, 0, "TrickMasterTrackUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrickMasterTrackSegmentUID = (ebml_context) {0xC4, MATROSKA_SEGMENTUID_CLASS, 0, 0, "TrickMasterTrackSegmentUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncodingOrder = (ebml_context) {0x5031, EBML_INTEGER_CLASS, 1, 0, "ContentEncodingOrder", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncodingScope = (ebml_context) {0x5032, EBML_INTEGER_CLASS, 1, 1, "ContentEncodingScope", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncodingType = (ebml_context) {0x5033, EBML_INTEGER_CLASS, 1, 0, "ContentEncodingType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentCompAlgo = (ebml_context) {0x4254, EBML_INTEGER_CLASS, 1, 0, "ContentCompAlgo", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentCompSettings = (ebml_context) {0x4255, EBML_BINARY_CLASS, 0, 0, "ContentCompSettings", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentCompression = (ebml_context) {0x5034, EBML_MASTER_CLASS, 0, 0, "ContentCompression", EBML_SemanticContentCompression, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncAlgo = (ebml_context) {0x47E1, EBML_INTEGER_CLASS, 1, 0, "ContentEncAlgo", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncKeyID = (ebml_context) {0x47E2, EBML_BINARY_CLASS, 0, 0, "ContentEncKeyID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAESSettingsCipherMode = (ebml_context) {0x47E8, EBML_INTEGER_CLASS, 0, 0, "AESSettingsCipherMode", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncAESSettings = (ebml_context) {0x47E7, EBML_MASTER_CLASS, 0, 0, "ContentEncAESSettings", EBML_SemanticContentEncAESSettings, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentSignature = (ebml_context) {0x47E3, EBML_BINARY_CLASS, 0, 0, "ContentSignature", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentSigKeyID = (ebml_context) {0x47E4, EBML_BINARY_CLASS, 0, 0, "ContentSigKeyID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentSigAlgo = (ebml_context) {0x47E5, EBML_INTEGER_CLASS, 1, 0, "ContentSigAlgo", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentSigHashAlgo = (ebml_context) {0x47E6, EBML_INTEGER_CLASS, 1, 0, "ContentSigHashAlgo", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncryption = (ebml_context) {0x5035, EBML_MASTER_CLASS, 0, 0, "ContentEncryption", EBML_SemanticContentEncryption, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncoding = (ebml_context) {0x6240, EBML_MASTER_CLASS, 0, 0, "ContentEncoding", EBML_SemanticContentEncoding, EBML_getSemanticGlobals()};
    MATROSKA_ContextContentEncodings = (ebml_context) {0x6D80, EBML_MASTER_CLASS, 0, 0, "ContentEncodings", EBML_SemanticContentEncodings, EBML_getSemanticGlobals()};
    MATROSKA_ContextTrackEntry = (ebml_context) {0xAE, MATROSKA_TRACKENTRY_CLASS, 0, 0, "TrackEntry", EBML_SemanticTrackEntry, EBML_getSemanticGlobals()};
    MATROSKA_ContextTracks = (ebml_context) {0x1654AE6B, EBML_MASTER_CLASS, 0, 0, "Tracks", EBML_SemanticTracks, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueTime = (ebml_context) {0xB3, EBML_INTEGER_CLASS, 0, 0, "CueTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueTrack = (ebml_context) {0xF7, EBML_INTEGER_CLASS, 0, 0, "CueTrack", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueClusterPosition = (ebml_context) {0xF1, EBML_INTEGER_CLASS, 0, 0, "CueClusterPosition", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRelativePosition = (ebml_context) {0xF0, EBML_INTEGER_CLASS, 0, 0, "CueRelativePosition", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueDuration = (ebml_context) {0xB2, EBML_INTEGER_CLASS, 0, 0, "CueDuration", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueBlockNumber = (ebml_context) {0x5378, EBML_INTEGER_CLASS, 0, 0, "CueBlockNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueCodecState = (ebml_context) {0xEA, EBML_INTEGER_CLASS, 1, 0, "CueCodecState", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRefTime = (ebml_context) {0x96, EBML_INTEGER_CLASS, 0, 0, "CueRefTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRefCluster = (ebml_context) {0x97, EBML_INTEGER_CLASS, 0, 0, "CueRefCluster", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRefNumber = (ebml_context) {0x535F, EBML_INTEGER_CLASS, 1, 1, "CueRefNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueRefCodecState = (ebml_context) {0xEB, EBML_INTEGER_CLASS, 1, 0, "CueRefCodecState", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueReference = (ebml_context) {0xDB, EBML_MASTER_CLASS, 0, 0, "CueReference", EBML_SemanticCueReference, EBML_getSemanticGlobals()};
    MATROSKA_ContextCueTrackPositions = (ebml_context) {0xB7, EBML_MASTER_CLASS, 0, 0, "CueTrackPositions", EBML_SemanticCueTrackPositions, EBML_getSemanticGlobals()};
    MATROSKA_ContextCuePoint = (ebml_context) {0xBB, MATROSKA_CUEPOINT_CLASS, 0, 0, "CuePoint", EBML_SemanticCuePoint, EBML_getSemanticGlobals()};
    MATROSKA_ContextCues = (ebml_context) {0x1C53BB6B, EBML_MASTER_CLASS, 0, 0, "Cues", EBML_SemanticCues, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileDescription = (ebml_context) {0x467E, EBML_UNISTRING_CLASS, 0, 0, "FileDescription", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileName = (ebml_context) {0x466E, EBML_UNISTRING_CLASS, 0, 0, "FileName", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileMediaType = (ebml_context) {0x4660, EBML_STRING_CLASS, 0, 0, "FileMediaType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileData = (ebml_context) {0x465C, MATROSKA_BIGBINARY_CLASS, 0, 0, "FileData", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileUID = (ebml_context) {0x46AE, EBML_INTEGER_CLASS, 0, 0, "FileUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileReferral = (ebml_context) {0x4675, EBML_BINARY_CLASS, 0, 0, "FileReferral", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileUsedStartTime = (ebml_context) {0x4661, EBML_INTEGER_CLASS, 0, 0, "FileUsedStartTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextFileUsedEndTime = (ebml_context) {0x4662, EBML_INTEGER_CLASS, 0, 0, "FileUsedEndTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextAttachedFile = (ebml_context) {0x61A7, MATROSKA_ATTACHMENT_CLASS, 0, 0, "AttachedFile", EBML_SemanticAttachedFile, EBML_getSemanticGlobals()};
    MATROSKA_ContextAttachments = (ebml_context) {0x1941A469, EBML_MASTER_CLASS, 0, 0, "Attachments", EBML_SemanticAttachments, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionUID = (ebml_context) {0x45BC, EBML_INTEGER_CLASS, 0, 0, "EditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionFlagHidden = (ebml_context) {0x45BD, EBML_BOOLEAN_CLASS, 1, 0, "EditionFlagHidden", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionFlagDefault = (ebml_context) {0x45DB, EBML_BOOLEAN_CLASS, 1, 0, "EditionFlagDefault", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionFlagOrdered = (ebml_context) {0x45DD, EBML_BOOLEAN_CLASS, 1, 0, "EditionFlagOrdered", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionString = (ebml_context) {0x4521, EBML_UNISTRING_CLASS, 0, 0, "EditionString", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionLanguageIETF = (ebml_context) {0x45E4, EBML_STRING_CLASS, 0, 0, "EditionLanguageIETF", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionDisplay = (ebml_context) {0x4520, EBML_MASTER_CLASS, 0, 0, "EditionDisplay", EBML_SemanticEditionDisplay, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterUID = (ebml_context) {0x73C4, EBML_INTEGER_CLASS, 0, 0, "ChapterUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterStringUID = (ebml_context) {0x5654, EBML_UNISTRING_CLASS, 0, 0, "ChapterStringUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTimeStart = (ebml_context) {0x91, EBML_INTEGER_CLASS, 0, 0, "ChapterTimeStart", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTimeEnd = (ebml_context) {0x92, EBML_INTEGER_CLASS, 0, 0, "ChapterTimeEnd", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterFlagHidden = (ebml_context) {0x98, EBML_BOOLEAN_CLASS, 1, 0, "ChapterFlagHidden", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterFlagEnabled = (ebml_context) {0x4598, EBML_BOOLEAN_CLASS, 1, 1, "ChapterFlagEnabled", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterSegmentUUID = (ebml_context) {0x6E67, MATROSKA_SEGMENTUID_CLASS, 0, 0, "ChapterSegmentUUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterSkipType = (ebml_context) {0x4588, EBML_INTEGER_CLASS, 0, 0, "ChapterSkipType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterSegmentEditionUID = (ebml_context) {0x6EBC, EBML_INTEGER_CLASS, 0, 0, "ChapterSegmentEditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterPhysicalEquiv = (ebml_context) {0x63C3, EBML_INTEGER_CLASS, 0, 0, "ChapterPhysicalEquiv", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTrackNumber = (ebml_context) {0x89, EBML_INTEGER_CLASS, 0, 0, "ChapterTrackNumber", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterTrack = (ebml_context) {0x8F, EBML_MASTER_CLASS, 0, 0, "ChapterTrack", EBML_SemanticChapterTrack, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapString = (ebml_context) {0x85, EBML_UNISTRING_CLASS, 0, 0, "ChapString", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapLanguage = (ebml_context) {0x437C, EBML_STRING_CLASS, 1, (intptr_t)"eng", "ChapLanguage", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapLanguageBCP47 = (ebml_context) {0x437D, EBML_STRING_CLASS, 0, 0, "ChapLanguageBCP47", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapCountry = (ebml_context) {0x437E, EBML_STRING_CLASS, 0, 0, "ChapCountry", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterDisplay = (ebml_context) {0x80, EBML_MASTER_CLASS, 0, 0, "ChapterDisplay", EBML_SemanticChapterDisplay, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessCodecID = (ebml_context) {0x6955, EBML_INTEGER_CLASS, 1, 0, "ChapProcessCodecID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessPrivate = (ebml_context) {0x450D, EBML_BINARY_CLASS, 0, 0, "ChapProcessPrivate", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessTime = (ebml_context) {0x6922, EBML_INTEGER_CLASS, 0, 0, "ChapProcessTime", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessData = (ebml_context) {0x6933, EBML_BINARY_CLASS, 0, 0, "ChapProcessData", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcessCommand = (ebml_context) {0x6911, EBML_MASTER_CLASS, 0, 0, "ChapProcessCommand", EBML_SemanticChapProcessCommand, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapProcess = (ebml_context) {0x6944, EBML_MASTER_CLASS, 0, 0, "ChapProcess", EBML_SemanticChapProcess, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapterAtom = (ebml_context) {0xB6, EBML_MASTER_CLASS, 0, 0, "ChapterAtom", EBML_SemanticChapterAtom, EBML_getSemanticGlobals()};
    MATROSKA_ContextEditionEntry = (ebml_context) {0x45B9, EBML_MASTER_CLASS, 0, 0, "EditionEntry", EBML_SemanticEditionEntry, EBML_getSemanticGlobals()};
    MATROSKA_ContextChapters = (ebml_context) {0x1043A770, EBML_MASTER_CLASS, 0, 0, "Chapters", EBML_SemanticChapters, EBML_getSemanticGlobals()};
    MATROSKA_ContextTargetTypeValue = (ebml_context) {0x68CA, EBML_INTEGER_CLASS, 1, 50, "TargetTypeValue", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTargetType = (ebml_context) {0x63CA, EBML_STRING_CLASS, 0, 0, "TargetType", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagTrackUID = (ebml_context) {0x63C5, EBML_INTEGER_CLASS, 1, 0, "TagTrackUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagEditionUID = (ebml_context) {0x63C9, EBML_INTEGER_CLASS, 1, 0, "TagEditionUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagChapterUID = (ebml_context) {0x63C4, EBML_INTEGER_CLASS, 1, 0, "TagChapterUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagAttachmentUID = (ebml_context) {0x63C6, EBML_INTEGER_CLASS, 1, 0, "TagAttachmentUID", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTargets = (ebml_context) {0x63C0, EBML_MASTER_CLASS, 0, 0, "Targets", EBML_SemanticTargets, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagName = (ebml_context) {0x45A3, EBML_UNISTRING_CLASS, 0, 0, "TagName", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagLanguage = (ebml_context) {0x447A, EBML_STRING_CLASS, 1, (intptr_t)"und", "TagLanguage", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagLanguageBCP47 = (ebml_context) {0x447B, EBML_STRING_CLASS, 0, 0, "TagLanguageBCP47", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagDefault = (ebml_context) {0x4484, EBML_BOOLEAN_CLASS, 1, 1, "TagDefault", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagDefaultBogus = (ebml_context) {0x44B4, EBML_BOOLEAN_CLASS, 1, 1, "TagDefaultBogus", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagString = (ebml_context) {0x4487, EBML_UNISTRING_CLASS, 0, 0, "TagString", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextTagBinary = (ebml_context) {0x4485, EBML_BINARY_CLASS, 0, 0, "TagBinary", NULL, EBML_getSemanticGlobals()};
    MATROSKA_ContextSimpleTag = (ebml_context) {0x67C8, EBML_MASTER_CLASS, 0, 0, "SimpleTag", EBML_SemanticSimpleTag, EBML_getSemanticGlobals()};
    MATROSKA_ContextTag = (ebml_context) {0x7373, EBML_MASTER_CLASS, 0, 0, "Tag", EBML_SemanticTag, EBML_getSemanticGlobals()};
    MATROSKA_ContextTags = (ebml_context) {0x1254C367, EBML_MASTER_CLASS, 0, 0, "Tags", EBML_SemanticTags, EBML_getSemanticGlobals()};
    MATROSKA_ContextSegment = (ebml_context) {0x18538067, EBML_MASTER_CLASS, 0, 0, "Segment", EBML_SemanticSegment, EBML_getSemanticGlobals()};
}